

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void reg_alloc(gen_ctx_t gen_ctx)

{
  uint32_t *puVar1;
  ulong *puVar2;
  int64_t *piVar3;
  VARR_int *pVVar4;
  live_range_t plVar5;
  VARR_MIR_reg_t *pVVar6;
  MIR_insn_t pMVar7;
  ra_ctx *prVar8;
  bb_t pbVar9;
  lr_bb_t plVar10;
  FILE *__stream;
  MIR_context_t pMVar11;
  long *plVar12;
  in_edge_t peVar13;
  in_edge_t peVar14;
  byte bVar15;
  double dVar16;
  spill_el_t *psVar17;
  anon_union_8_2_0ec0d2a8_for_u aVar18;
  undefined1 auVar19 [32];
  MIR_insn_t *ppMVar20;
  MIR_insn_t tail_insn;
  char cVar21;
  char cVar22;
  char cVar23;
  undefined1 uVar24;
  ulong uVar25;
  live_range_t_conflict *pplVar26;
  bb_t_conflict *ppbVar27;
  VARR_bb_t *pVVar28;
  MIR_insn_t pMVar29;
  int *piVar30;
  lr_ctx *plVar31;
  spill_cache_el_t *psVar32;
  bitmap_t pVVar33;
  spill_el_t *psVar34;
  VARR_spill_el_t *pVVar35;
  bitmap_el_t *pbVar36;
  bitmap_t pVVar37;
  ulong extraout_RAX;
  bb_t_conflict pbVar38;
  MIR_insn_t_conflict pMVar39;
  bb_t_conflict pbVar40;
  anon_union_8_2_0ec0d2a8_for_u *paVar41;
  bb_t_conflict pbVar42;
  void *pvVar43;
  bb_t pbVar44;
  bitmap_t pVVar45;
  bb_insn_t_conflict pbVar46;
  VARR_live_range_t *pVVar47;
  func_cfg_t pfVar48;
  bb_t pbVar49;
  size_t *psVar50;
  out_edge_t peVar51;
  in_edge_t_conflict peVar52;
  DLIST_LINK_in_edge_t *pDVar53;
  DLIST_in_edge_t *pDVar54;
  bb_insn_t pbVar55;
  bb_t *ppbVar56;
  int iVar57;
  bb *pbVar58;
  ulong uVar59;
  VARR_spill_cache_el_t *pVVar60;
  lr_bb_t_conflict plVar61;
  in_edge_t peVar62;
  uint uVar63;
  MIR_reg_t MVar64;
  ulong uVar65;
  gen_ctx_t pgVar66;
  ulong uVar67;
  MIR_insn_t pMVar68;
  size_t sVar69;
  char *pcVar70;
  DLIST_dead_var_t *pDVar71;
  gen_ctx_t pgVar72;
  gen_ctx_t pgVar73;
  live_range_t_conflict plVar74;
  MIR_op_t *pMVar75;
  live_range_t_conflict plVar76;
  live_range_t_conflict plVar77;
  uint uVar78;
  in_edge_t peVar79;
  bitmap_t *ppVVar80;
  lr_bb_t_conflict plVar81;
  edge_t_conflict peVar82;
  long lVar83;
  gen_ctx_t unaff_R13;
  long lVar84;
  char *pcVar85;
  spill_el_t *e2;
  bb_t_conflict bb_insn;
  size_t sVar86;
  long lVar87;
  char *pcVar88;
  bitmap_t *ppVVar89;
  MIR_reg_t *reg_map;
  bool bVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar93 [16];
  undefined1 in_ZMM2 [64];
  int iStack_1b4;
  bb_t_conflict pbStack_1b0;
  bb_t_conflict pbStack_1a8;
  bb_t_conflict pbStack_1a0;
  DLIST_in_edge_t *pDStack_198;
  uint uStack_190;
  undefined1 auStack_18c [108];
  bitmap_t pVStack_120;
  in_edge_t peStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  gen_ctx_t local_f8;
  gen_ctx_t local_f0;
  bb_t_conflict local_e8;
  in_edge_t local_e0;
  bb_t_conflict local_d8;
  MIR_reg_t local_cc;
  MIR_context_t local_c8;
  bb_t_conflict local_c0;
  MIR_insn_t_conflict local_b8;
  bitmap_t local_b0;
  bb_insn_t local_a8;
  DLIST_LINK_in_edge_t *local_a0;
  rewrite_data local_98 [2];
  undefined1 local_68 [16];
  int64_t iStack_58;
  char *pcStack_50;
  out_edge_t peStack_48;
  out_edge_t peStack_40;
  
  local_f0 = (gen_ctx_t)(ulong)gen_ctx->curr_cfg->max_var;
  uVar63 = gen_ctx->optimize_level;
  plVar31 = gen_ctx->lr_ctx;
  plVar31->curr_point = 0;
  pVVar47 = plVar31->var_live_ranges;
  if (pVVar47 == (VARR_live_range_t *)0x0) {
LAB_0015e7f8:
    auStack_18c._92_8_ = 0x15e7fd;
    reg_alloc_cold_87();
LAB_0015e7fd:
    auStack_18c._92_8_ = 0x15e81c;
    __assert_fail("(VARR_live_range_tlength (gen_ctx->lr_ctx->var_live_ranges)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1980,"void build_live_ranges(gen_ctx_t)");
  }
  if (pVVar47->els_num != 0) goto LAB_0015e7fd;
  pbVar58 = (bb *)((long)&local_f0->ctx + 1);
  local_f8 = gen_ctx;
  do {
    pVVar47 = gen_ctx->lr_ctx->var_live_ranges;
    if (pVVar47->varr == (live_range_t_conflict *)0x0) goto LAB_0015e64e;
    uVar25 = pVVar47->els_num + 1;
    if (pVVar47->size < uVar25) {
      sVar86 = (uVar25 >> 1) + uVar25;
      auStack_18c._92_8_ = 0x15be51;
      pplVar26 = (live_range_t_conflict *)realloc(pVVar47->varr,sVar86 * 8);
      pVVar47->varr = pplVar26;
      pVVar47->size = sVar86;
      gen_ctx = local_f8;
    }
    sVar86 = pVVar47->els_num;
    pVVar47->els_num = sVar86 + 1;
    pVVar47->varr[sVar86] = (live_range_t_conflict)0x0;
    pbVar58 = (bb *)((long)(pbVar58 + 0xffffffffffffffff) + 0xa7);
  } while (pbVar58 != (bb *)0x0);
  local_e8 = (bb_t_conflict)CONCAT44(local_e8._4_4_,uVar63);
  if (gen_ctx->optimize_level != 0) {
    pVVar28 = gen_ctx->data_flow_ctx->worklist;
    if ((pVVar28 == (VARR_bb_t *)0x0) || (pVVar28->varr == (bb_t_conflict *)0x0)) {
      auStack_18c._92_8_ = 0x15e7f8;
      reg_alloc_cold_5();
      goto LAB_0015e7f8;
    }
    pVVar28->els_num = 0;
    for (pbVar38 = (gen_ctx->curr_cfg->bbs).head; pbVar38 != (bb_t_conflict)0x0;
        pbVar38 = (pbVar38->bb_link).next) {
      pVVar28 = gen_ctx->data_flow_ctx->worklist;
      if (pVVar28->varr == (bb_t_conflict *)0x0) {
        auStack_18c._92_8_ = 0x15e6c3;
        reg_alloc_cold_1();
        goto LAB_0015e6c3;
      }
      uVar25 = pVVar28->els_num + 1;
      if (pVVar28->size < uVar25) {
        sVar86 = (uVar25 >> 1) + uVar25;
        auStack_18c._92_8_ = 0x15bef6;
        ppbVar27 = (bb_t_conflict *)realloc(pVVar28->varr,sVar86 * 8);
        pVVar28->varr = ppbVar27;
        pVVar28->size = sVar86;
        gen_ctx = local_f8;
      }
      sVar86 = pVVar28->els_num;
      pVVar28->els_num = sVar86 + 1;
      pVVar28->varr[sVar86] = pbVar38;
    }
    if (gen_ctx->optimize_level < 2) {
      pVVar28 = gen_ctx->data_flow_ctx->worklist;
      if (pVVar28 == (VARR_bb_t *)0x0) goto LAB_0015e8a6;
      auStack_18c._92_8_ = 0x15bf4d;
      qsort(pVVar28->varr,pVVar28->els_num,8,post_cmp);
      gen_ctx = local_f8;
    }
    pVVar28 = gen_ctx->data_flow_ctx->worklist;
    if (pVVar28 != (VARR_bb_t *)0x0) {
      uVar25 = 0;
      do {
        if (pVVar28->els_num <= uVar25) goto LAB_0015c04e;
        if (pVVar28->varr == (bb_t_conflict *)0x0) goto LAB_0015e690;
        pbVar38 = pVVar28->varr[uVar25];
        pbVar55 = (pbVar38->bb_insns).head;
        if (pbVar55 != (bb_insn_t)0x0) {
          auStack_18c._92_8_ = 0x15bf98;
          process_bb_ranges(gen_ctx,pbVar38,pbVar55->insn,((pbVar38->bb_insns).tail)->insn);
          gen_ctx = local_f8;
        }
        uVar25 = uVar25 + 1;
        pVVar28 = gen_ctx->data_flow_ctx->worklist;
      } while (pVVar28 != (VARR_bb_t *)0x0);
    }
    auStack_18c._92_8_ = 0x15bfb4;
    reg_alloc_cold_3();
  }
  pMVar39 = (((gen_ctx->curr_func_item->u).func)->insns).head;
  pMVar7 = pMVar39;
joined_r0x0015bfc3:
  tail_insn = pMVar39;
  if (tail_insn != (MIR_insn_t)0x0) {
    if (gen_ctx->optimize_level == 0) {
      uVar63 = *(int *)&pMVar7->field_0x18 - 0xa7;
      pMVar68 = pMVar7;
      if ((uVar63 < 0xe) && ((0x2007U >> (uVar63 & 0x1f) & 1) != 0)) {
        pMVar68 = (MIR_insn_t)pMVar7->data;
      }
    }
    else {
      pMVar68 = (MIR_insn_t)((long)pMVar7->data + 0x30);
    }
    pMVar39 = (tail_insn->insn_link).next;
    if (pMVar39 != (MIR_insn_t)0x0) goto code_r0x0015c00b;
    goto LAB_0015c036;
  }
LAB_0015c04e:
  if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
    auStack_18c._92_8_ = 0x15c064;
    print_all_live_ranges(gen_ctx);
    gen_ctx = local_f8;
  }
  plVar31 = gen_ctx->lr_ctx;
  pVVar45 = plVar31->points_with_born_vars;
  if ((pVVar45 == (bitmap_t)0x0) || (pVVar45->varr == (bitmap_el_t *)0x0)) {
LAB_0015e7c2:
    auStack_18c._92_8_ = 0x15e7c7;
    reg_alloc_cold_85();
  }
  else {
    pVVar45->els_num = 0;
    pVVar45 = plVar31->points_with_dead_vars;
    if ((pVVar45 != (bitmap_t)0x0) && (pVVar45->varr != (bitmap_el_t *)0x0)) {
      pVVar45->els_num = 0;
      pVVar47 = plVar31->var_live_ranges;
      if (pVVar47 == (VARR_live_range_t *)0x0) {
LAB_0015e67c:
        auStack_18c._92_8_ = 0x15e681;
        reg_alloc_cold_83();
LAB_0015e681:
        auStack_18c._92_8_ = 0x15e686;
        reg_alloc_cold_9();
LAB_0015e686:
        auStack_18c._92_8_ = 0x15e68b;
        reg_alloc_cold_8();
LAB_0015e68b:
        auStack_18c._92_8_ = 0x15e690;
        reg_alloc_cold_25();
LAB_0015e690:
        auStack_18c._92_8_ = 0x15e695;
        reg_alloc_cold_2();
LAB_0015e695:
        auStack_18c._92_8_ = 0x15e69a;
        reg_alloc_cold_63();
LAB_0015e69a:
        auStack_18c._92_8_ = 0x15e69f;
        reg_alloc_cold_21();
LAB_0015e69f:
        auStack_18c._92_8_ = 0x15e6be;
        __assert_fail("reg > ST1_HARD_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x210e,"void split(gen_ctx_t)");
      }
      if (pVVar47->els_num != 0) {
        uVar25 = 0;
        do {
          if (pVVar47->varr == (live_range_t_conflict *)0x0) goto LAB_0015e686;
          pgVar66 = gen_ctx;
          for (plVar76 = pVVar47->varr[uVar25]; gen_ctx = pgVar66,
              plVar76 != (live_range_t_conflict)0x0; plVar76 = plVar76->next) {
            uVar65 = (ulong)plVar76->start;
            if (plVar76->finish < plVar76->start) goto LAB_0015e5bf;
            pVVar45 = gen_ctx->lr_ctx->points_with_born_vars;
            auStack_18c._92_8_ = 0x15c111;
            bitmap_expand(pVVar45,uVar65 + 1);
            if (pVVar45 == (bitmap_t)0x0) goto LAB_0015e5ba;
            pVVar45->varr[uVar65 >> 6] = pVVar45->varr[uVar65 >> 6] | 1L << (uVar65 & 0x3f);
            pVVar45 = gen_ctx->lr_ctx->points_with_dead_vars;
            uVar65 = (ulong)plVar76->finish;
            auStack_18c._92_8_ = 0x15c14a;
            bitmap_expand(pVVar45,uVar65 + 1);
            if (pVVar45 == (bitmap_t)0x0) {
              auStack_18c._92_8_ = 0x15e5e3;
              reg_alloc_cold_6();
              goto LAB_0015e5e3;
            }
            pVVar45->varr[uVar65 >> 6] = pVVar45->varr[uVar65 >> 6] | 1L << (uVar65 & 0x3f);
            pgVar66 = local_f8;
            unaff_R13 = gen_ctx;
          }
          plVar31 = gen_ctx->lr_ctx;
          pVVar47 = plVar31->var_live_ranges;
          if (pVVar47 == (VARR_live_range_t *)0x0) goto LAB_0015e67c;
          uVar25 = uVar25 + 1;
        } while (uVar25 < pVVar47->els_num);
      }
      pVVar4 = plVar31->point_map;
      if ((pVVar4 == (VARR_int *)0x0) || (pVVar4->varr == (int *)0x0)) goto LAB_0015e7cc;
      pVVar4->els_num = 0;
      plVar31 = gen_ctx->lr_ctx;
      if (-1 < plVar31->curr_point) {
        iVar57 = -1;
        do {
          pVVar4 = plVar31->point_map;
          if (pVVar4->varr == (int *)0x0) goto LAB_0015e681;
          uVar25 = pVVar4->els_num + 1;
          if (pVVar4->size < uVar25) {
            sVar86 = (uVar25 >> 1) + uVar25;
            auStack_18c._92_8_ = 0x15c1fe;
            piVar30 = (int *)realloc(pVVar4->varr,sVar86 * 4);
            pVVar4->varr = piVar30;
            pVVar4->size = sVar86;
            gen_ctx = local_f8;
          }
          sVar86 = pVVar4->els_num;
          pVVar4->els_num = sVar86 + 1;
          pVVar4->varr[sVar86] = 0;
          plVar31 = gen_ctx->lr_ctx;
          iVar57 = iVar57 + 1;
        } while (iVar57 < plVar31->curr_point);
      }
      auStack_18c._92_8_ = 0x15c242;
      pgVar66 = gen_ctx;
      bitmap_ior(plVar31->points_with_born_or_dead_vars,plVar31->points_with_born_vars,
                 plVar31->points_with_dead_vars);
      plVar31 = gen_ctx->lr_ctx;
      pVVar45 = plVar31->points_with_born_or_dead_vars;
      if (pVVar45 != (bitmap_t)0x0) {
        uVar25 = pVVar45->els_num;
        pbVar36 = pVVar45->varr;
        lVar84 = -1;
        pgVar72 = (gen_ctx_t)0x0;
        uVar63 = 1;
LAB_0015c273:
        uVar65 = (ulong)pgVar72 >> 6;
        bVar90 = true;
        pgVar73 = pgVar72;
        if (uVar65 < uVar25) {
LAB_0015c282:
          if ((pbVar36[uVar65] == 0) ||
             (uVar59 = pbVar36[uVar65] >> ((ulong)pgVar72 & 0x3f), uVar59 == 0)) goto LAB_0015c295;
          uVar65 = uVar59 & 1;
          pgVar66 = pgVar72;
          while (uVar65 == 0) {
            pgVar66 = (gen_ctx_t)((long)&pgVar66->ctx + 1);
            uVar65 = uVar59 & 2;
            uVar59 = uVar59 >> 1;
          }
          bVar90 = false;
          pgVar73 = (gen_ctx_t)((long)&pgVar66->ctx + 1);
        }
LAB_0015c2c8:
        if (!bVar90) {
          pVVar45 = plVar31->points_with_born_vars;
          if (pVVar45 == (bitmap_t)0x0) {
            auStack_18c._92_8_ = 0x15e677;
            reg_alloc_cold_13();
LAB_0015e677:
            auStack_18c._92_8_ = 0x15e67c;
            reg_alloc_cold_12();
            goto LAB_0015e67c;
          }
          if (pgVar66 < (gen_ctx_t)(pVVar45->els_num << 6)) {
            bVar90 = (pVVar45->varr[(ulong)pgVar66 >> 6] >> ((ulong)pgVar66 & 0x3f) & 1) != 0;
          }
          else {
            bVar90 = false;
          }
          pVVar45 = plVar31->points_with_dead_vars;
          if (pVVar45 == (bitmap_t)0x0) goto LAB_0015e677;
          uVar78 = 0;
          if (pgVar66 < (gen_ctx_t)(pVVar45->els_num << 6)) {
            uVar78 = (uint)(pVVar45->varr[(ulong)pgVar66 >> 6] >> ((ulong)pgVar66 & 0x3f)) & 1;
          }
          if (uVar78 == 0 && !bVar90) goto LAB_0015e653;
          pVVar4 = plVar31->point_map;
          if (!(bool)(uVar63 != 0 & bVar90)) {
            if (((pVVar4 != (VARR_int *)0x0) && (piVar30 = pVVar4->varr, piVar30 != (int *)0x0)) &&
               (pgVar66 < (gen_ctx_t)pVVar4->els_num)) goto LAB_0015c399;
LAB_0015e644:
            auStack_18c._92_8_ = 0x15e649;
            reg_alloc_cold_10();
LAB_0015e649:
            auStack_18c._92_8_ = 0x15e64e;
            reg_alloc_cold_11();
LAB_0015e64e:
            auStack_18c._92_8_ = 0x15e653;
            reg_alloc_cold_86();
LAB_0015e653:
            auStack_18c._92_8_ = 0x15e672;
            __assert_fail("born_p || dead_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x18e9,"void shrink_live_ranges(gen_ctx_t)");
          }
          if (((pVVar4 == (VARR_int *)0x0) || (piVar30 = pVVar4->varr, piVar30 == (int *)0x0)) ||
             ((gen_ctx_t)pVVar4->els_num <= pgVar66)) goto LAB_0015e649;
          lVar84 = lVar84 + 1;
LAB_0015c399:
          piVar30[(long)pgVar66] = (int)lVar84;
          pgVar72 = pgVar73;
          uVar63 = uVar78;
          goto LAB_0015c273;
        }
        pVVar47 = plVar31->var_live_ranges;
        if (pVVar47 == (VARR_live_range_t *)0x0) goto LAB_0015e821;
        sVar86 = pVVar47->els_num;
        if (sVar86 == 0) {
          lVar87 = 0;
          lVar83 = 0;
        }
        else {
          pplVar26 = pVVar47->varr;
          if (pplVar26 == (live_range_t_conflict *)0x0) goto LAB_0015e83f;
          lVar83 = 0;
          lVar87 = 0;
          sVar69 = 0;
          do {
            plVar76 = pplVar26[sVar69];
            if (plVar76 != (live_range_t_conflict)0x0) {
              pVVar4 = plVar31->point_map;
              if ((pVVar4 == (VARR_int *)0x0) || (piVar30 = pVVar4->varr, piVar30 == (int *)0x0)) {
LAB_0015e5b5:
                auStack_18c._92_8_ = 0x15e5ba;
                reg_alloc_cold_15();
LAB_0015e5ba:
                auStack_18c._92_8_ = 0x15e5bf;
                reg_alloc_cold_7();
LAB_0015e5bf:
                auStack_18c._92_8_ = 0x15e5de;
                __assert_fail("lr->start <= lr->finish",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x18db,"void shrink_live_ranges(gen_ctx_t)");
              }
              pgVar66 = (gen_ctx_t)pVVar4->els_num;
              plVar77 = (live_range_t_conflict)0x0;
              do {
                if (pgVar66 <= (gen_ctx_t)(long)plVar76->start) goto LAB_0015e5b5;
                plVar5 = plVar76->next;
                iVar57 = piVar30[plVar76->start];
                plVar76->start = iVar57;
                unaff_R13 = (gen_ctx_t)(long)plVar76->finish;
                if (pgVar66 <= unaff_R13) goto LAB_0015e5e3;
                uVar63 = piVar30[(long)unaff_R13];
                plVar76->finish = uVar63;
                if (plVar77 == (live_range_t_conflict)0x0) {
LAB_0015c457:
                  lVar87 = lVar87 + 1;
                  plVar77 = plVar76;
                }
                else {
                  uVar78 = plVar77->start;
                  unaff_R13 = (gen_ctx_t)(ulong)uVar78;
                  if (((uVar78 != uVar63) && (uVar78 != uVar63 + 1)) ||
                     (bVar90 = plVar76->lr_bb == (lr_bb_t_conflict)0x0,
                     unaff_R13 = (gen_ctx_t)(ulong)CONCAT31((int3)(uVar78 >> 8),bVar90),
                     (plVar77->lr_bb == (lr_bb_t_conflict)0x0) != bVar90)) goto LAB_0015c457;
                  plVar77->start = iVar57;
                  plVar77->next = plVar5;
                  plVar61 = plVar76->lr_bb;
                  while (plVar61 != (lr_bb_t_conflict)0x0) {
                    plVar10 = plVar61->next;
                    plVar61->next = plVar77->lr_bb;
                    plVar77->lr_bb = plVar61;
                    plVar76->lr_bb = plVar10;
                    plVar61 = plVar10;
                  }
                  unaff_R13 = (gen_ctx_t)plVar76->lr_bb;
                  if (unaff_R13 != (gen_ctx_t)0x0) {
                    pgVar72 = (gen_ctx_t)plVar31->free_lr_bb_list;
                    do {
                      pgVar73 = unaff_R13;
                      unaff_R13 = *(gen_ctx_t *)&pgVar73->optimize_level;
                      *(gen_ctx_t *)&pgVar73->optimize_level = pgVar72;
                      pgVar72 = pgVar73;
                    } while (unaff_R13 != (gen_ctx_t)0x0);
                    plVar31->free_lr_bb_list = (lr_bb_t_conflict)pgVar73;
                    unaff_R13 = (gen_ctx_t)0x0;
                  }
                  plVar76->next = plVar31->free_lr_list;
                  plVar31->free_lr_list = plVar76;
                }
                lVar83 = lVar83 + 1;
                plVar76 = plVar5;
              } while (plVar5 != (live_range_t)0x0);
            }
            sVar69 = sVar69 + 1;
          } while (sVar69 != sVar86);
        }
        pcVar85 = (char *)(lVar84 + 1);
        if (((FILE *)local_f8->debug_file != (FILE *)0x0) && (1 < local_f8->debug_level)) {
          auStack_18c._92_8_ = 0x15c51f;
          fprintf((FILE *)local_f8->debug_file,
                  "Compressing live range points: from %d to %ld - %ld%%\n",
                  (ulong)(uint)plVar31->curr_point,pcVar85);
          if (lVar87 != lVar83) {
            auStack_18c._92_8_ = 0x15c55a;
            fprintf((FILE *)local_f8->debug_file,
                    "Compressing live ranges: from %ld to %ld - %ld%%\n",lVar83,lVar87);
          }
        }
        local_f8->lr_ctx->curr_point = (int)pcVar85;
        if (((FILE *)local_f8->debug_file != (FILE *)0x0) && (1 < local_f8->debug_level)) {
          auStack_18c._92_8_ = 0x15c58f;
          fwrite("Ranges after the compression:\n",0x1e,1,(FILE *)local_f8->debug_file);
          auStack_18c._92_8_ = 0x15c599;
          print_all_live_ranges(local_f8);
        }
        auStack_18c._92_8_ = 0x15c5a6;
        assign(local_f8);
        pgVar66 = local_f8;
        if (((FILE *)local_f8->debug_file != (FILE *)0x0) && (1 < local_f8->debug_level)) {
          auStack_18c._92_8_ = 0x15c5d8;
          fwrite("+++++++++++++Disposition after assignment:",0x2a,1,(FILE *)local_f8->debug_file);
          if ((uint)local_f0 < 0x22) {
LAB_0015c6be:
            pgVar66 = local_f8;
            auStack_18c._92_8_ = 0x15c6d1;
            fputc(10,(FILE *)local_f8->debug_file);
            goto LAB_0015c6d4;
          }
          uVar25 = 0x22;
          pcVar85 = " %3u=>";
          do {
            if ((uVar25 & 7) == 0) {
              auStack_18c._92_8_ = 0x15c616;
              fputc(10,(FILE *)local_f8->debug_file);
            }
            auStack_18c._92_8_ = 0x15c62b;
            fprintf((FILE *)local_f8->debug_file," %3u=>",uVar25);
            pVVar47 = local_f8->lr_ctx->var_live_ranges;
            if (pVVar47 == (VARR_live_range_t *)0x0) {
              auStack_18c._92_8_ = 0x15e74e;
              reg_alloc_cold_19();
LAB_0015e74e:
              auStack_18c._92_8_ = 0x15e753;
              reg_alloc_cold_17();
              goto LAB_0015e753;
            }
            if (uVar25 < pVVar47->els_num) {
              if (pVVar47->varr != (live_range_t_conflict *)0x0) {
                if (pVVar47->varr[uVar25] == (live_range_t_conflict)0x0) goto LAB_0015c69c;
                pVVar6 = local_f8->ra_ctx->reg_renumber;
                if (((pVVar6 == (VARR_MIR_reg_t *)0x0) || (pVVar6->varr == (MIR_reg_t *)0x0)) ||
                   (pVVar6->els_num <= uVar25)) goto LAB_0015e74e;
                auStack_18c._92_8_ = 0x15c69a;
                fprintf((FILE *)local_f8->debug_file,"%-2u",(ulong)pVVar6->varr[uVar25]);
                goto LAB_0015c6b2;
              }
              auStack_18c._92_8_ = 0x15e7c2;
              reg_alloc_cold_18();
              goto LAB_0015e7c2;
            }
LAB_0015c69c:
            auStack_18c._92_8_ = 0x15c6b2;
            fwrite("UA",2,1,(FILE *)local_f8->debug_file);
LAB_0015c6b2:
            uVar63 = (int)uVar25 + 1;
            uVar25 = (ulong)uVar63;
            if ((uint)local_f0 < uVar63) goto LAB_0015c6be;
          } while( true );
        }
LAB_0015c6d4:
        local_cc = 5 - (pgVar66->target_ctx->keep_fp_p == '\0');
        auStack_18c._92_8_ = 0x15c6fb;
        local_c8 = (MIR_context_t)
                   _MIR_get_module_global_var_hard_regs
                             (pgVar66->ctx,pgVar66->curr_func_item->module);
        auVar91 = in_ZMM0._0_16_;
        auVar93 = in_ZMM2._0_16_;
        pgVar66 = local_f8;
        if (local_f8->optimize_level < 2) {
          pMVar39 = (((local_f8->curr_func_item->u).func)->insns).head;
          if (pMVar39 == (MIR_insn_t_conflict)0x0) {
LAB_0015ca4f:
            lVar84 = 0;
            lVar83 = 0;
            pbVar38 = (bb_t_conflict)0x0;
          }
          else {
            lVar83 = 0;
            pbVar38 = (bb_t_conflict)0x0;
            lVar84 = 0;
            do {
              pMVar7 = (pMVar39->insn_link).next;
              pbVar38 = (bb_t_conflict)
                        ((long)&pbVar38->index +
                        (ulong)((*(ulong *)&pMVar39->field_0x18 & 0xfffffffc) == 0));
              auStack_18c._92_8_ = 0x15c74a;
              uVar63 = rewrite_insn(local_f8,pMVar39,local_cc,(rewrite_data *)0x0);
              auVar91 = in_ZMM0._0_16_;
              auVar93 = in_ZMM2._0_16_;
              lVar84 = lVar84 + (ulong)uVar63;
              lVar83 = lVar83 + 1;
              pMVar39 = pMVar7;
              pgVar66 = local_f8;
            } while (pMVar7 != (MIR_insn_t)0x0);
          }
          goto LAB_0015ca57;
        }
        pVVar45 = local_f8->temp_bitmap;
        peVar79 = (in_edge_t)local_f8->temp_bitmap2;
        prVar8 = local_f8->ra_ctx;
        puVar1 = &prVar8->spill_cache_age;
        *puVar1 = *puVar1 + 1;
        pVVar60 = prVar8->spill_cache;
        if ((pVVar60 == (VARR_spill_cache_el_t *)0x0) || (pVVar60->varr == (spill_cache_el_t *)0x0))
        goto LAB_0015e826;
        pVVar60->els_num = 0;
        local_e0 = peVar79;
        local_b0 = pVVar45;
        while( true ) {
          pfVar48 = pgVar66->curr_cfg;
          if ((ulong)pfVar48->max_var < pVVar60->els_num) break;
          if (pVVar60->varr == (spill_cache_el_t *)0x0) goto LAB_0015e69a;
          uVar25 = pVVar60->els_num + 1;
          if (pVVar60->size < uVar25) {
            pcVar85 = (char *)((uVar25 >> 1) + uVar25);
            auStack_18c._92_8_ = 0x15c7e2;
            psVar32 = (spill_cache_el_t *)realloc(pVVar60->varr,(long)pcVar85 * 8);
            pVVar60->varr = psVar32;
            pVVar60->size = (size_t)pcVar85;
            pgVar66 = local_f8;
            peVar79 = local_e0;
          }
          sVar86 = pVVar60->els_num;
          pfVar48 = (func_cfg_t)pVVar60->varr;
          pVVar60->els_num = sVar86 + 1;
          *(undefined8 *)(&pfVar48->max_var + sVar86 * 2) = 0;
          pVVar60 = pgVar66->ra_ctx->spill_cache;
          if (pVVar60 == (VARR_spill_cache_el_t *)0x0) {
            auStack_18c._92_8_ = 0x15c822;
            reg_alloc_cold_20();
            break;
          }
        }
        auVar91 = in_ZMM0._0_16_;
        auVar93 = in_ZMM2._0_16_;
        pgVar72 = (gen_ctx_t)(pfVar48->bbs).head;
        if (pgVar72 == (gen_ctx_t)0x0) goto LAB_0015ca4f;
        lVar83 = 0;
        lVar84 = 0;
        pbVar38 = (bb_t_conflict)0x0;
LAB_0015c837:
        local_98[0].live = local_b0;
        auStack_18c._92_8_ = 0x15c862;
        local_f0 = pgVar72;
        local_98[0].bb = (bb_t_conflict)pgVar72;
        local_98[0].regs_to_save = (bitmap_t)peVar79;
        bitmap_copy(local_b0,pgVar72->call_used_hard_regs[1]);
        if ((local_e0 == (in_edge_t)0x0) || ((local_e0->in_link).prev == (in_edge_t)0x0))
        goto LAB_0015e68b;
        local_e0->src = (bb_t)0x0;
        pbVar55 = (bb_insn_t)local_f0->temp_bitmap2;
        while (pbVar55 != (bb_insn_t)0x0) {
          ppMVar20 = &pbVar55->insn;
          pbVar55 = (pbVar55->bb_insn_link).prev;
          pbVar38 = (bb_t_conflict)
                    ((long)&pbVar38->index +
                    (ulong)((*(ulong *)&(*ppMVar20)->field_0x18 & 0xfffffffc) == 0));
          auStack_18c._92_8_ = 0x15c8bf;
          uVar63 = rewrite_insn(local_f8,*ppMVar20,local_cc,local_98);
          lVar84 = lVar84 + (ulong)uVar63;
          lVar83 = lVar83 + 1;
        }
        local_c0 = pbVar38;
        if (local_b0 == (bitmap_t)0x0) goto LAB_0015e6cd;
        pVVar45 = local_f0->call_used_hard_regs[0];
        if (pVVar45 != (bitmap_t)0x0) {
          pcVar88 = (char *)local_b0->els_num;
          pcVar85 = (char *)pVVar45->els_num;
          pVVar33 = local_b0;
          pcVar70 = pcVar88;
          if (pcVar85 < pcVar88) {
            pVVar33 = pVVar45;
            pVVar45 = local_b0;
            pcVar70 = pcVar85;
            pcVar85 = pcVar88;
          }
          pbVar36 = pVVar45->varr;
          auStack_18c._92_8_ = 0x15c928;
          iVar57 = bcmp(pVVar33->varr,pbVar36,(long)pcVar70 * 8);
          MVar64 = local_cc;
          if (iVar57 == 0) {
            if (pcVar70 < pcVar85) {
              do {
                if (pbVar36[(long)pcVar70] != 0) goto LAB_0015e620;
                pcVar70 = pcVar70 + 1;
              } while (pcVar85 != pcVar70);
            }
            pgVar66 = (gen_ctx_t)0x0;
            do {
              auVar91 = in_ZMM0._0_16_;
              auVar93 = in_ZMM2._0_16_;
              pbVar49 = (bb_t)((ulong)pgVar66 >> 6);
              pbVar44 = local_e0->src;
              bVar90 = true;
              pgVar72 = pgVar66;
              if (pbVar49 < pbVar44) {
                pgVar72 = (gen_ctx_t)((long)pbVar44 << 6);
LAB_0015c975:
                pbVar9 = (&((local_e0->in_link).prev)->src)[(long)pbVar49];
                if ((pbVar9 == (bb_t)0x0) ||
                   (uVar25 = (ulong)pbVar9 >> ((ulong)pgVar66 & 0x3f), uVar25 == 0))
                goto LAB_0015c988;
                uVar65 = uVar25 & 1;
                unaff_R13 = pgVar66;
                while (uVar65 == 0) {
                  unaff_R13 = (gen_ctx_t)((long)&unaff_R13->ctx + 1);
                  uVar65 = uVar25 & 2;
                  uVar25 = uVar25 >> 1;
                }
                pgVar72 = (gen_ctx_t)((long)&unaff_R13->ctx + 1);
                bVar90 = false;
              }
LAB_0015c9bc:
              if (bVar90) goto LAB_0015ca3b;
              if (unaff_R13 < (gen_ctx_t)0x22) goto LAB_0015e5f2;
              pVVar45 = local_f0->call_used_hard_regs[3];
              if (pVVar45 == (bitmap_t)0x0) goto LAB_0015e5ed;
              if ((pVVar45->els_num << 6 <= ((ulong)unaff_R13 & 0xffffffff)) ||
                 ((pVVar45->varr[(ulong)unaff_R13 >> 6 & 0x3ffffff] >> ((ulong)unaff_R13 & 0x3f) & 1
                  ) == 0)) {
LAB_0015e596:
                auStack_18c._92_8_ = 0x15e5b5;
                __assert_fail("bitmap_bit_p (bb->kill, reg)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x201b,"void rewrite(gen_ctx_t)");
              }
              pMVar7 = ((DLIST_bb_insn_t *)&local_f0->temp_bitmap)->head->insn;
              auStack_18c._92_8_ = 0x15ca2c;
              spill_restore_reg(local_f8,(MIR_reg_t)unaff_R13,MVar64,pMVar7,
                                (uint)(*(int *)&pMVar7->field_0x18 == 0xb4),0);
              pgVar66 = pgVar72;
            } while( true );
          }
          goto LAB_0015e620;
        }
        goto LAB_0015e6d2;
      }
      auStack_18c._92_8_ = 0x15e821;
      reg_alloc_cold_81();
LAB_0015e821:
      auStack_18c._92_8_ = 0x15e826;
      reg_alloc_cold_80();
LAB_0015e826:
      auStack_18c._92_8_ = 0x15e82b;
      reg_alloc_cold_26();
      goto LAB_0015e82b;
    }
  }
  auStack_18c._92_8_ = 0x15e7cc;
  reg_alloc_cold_84();
LAB_0015e7cc:
  auStack_18c._92_8_ = 0x15e7d1;
  reg_alloc_cold_82();
LAB_0015e7d1:
  auStack_18c._92_8_ = 0x15e7f3;
  __assert_fail("(DLIST_out_edge_t_length (&(e->dst->out_edges))) == 1 && (DLIST_in_edge_t_length (&(e->dst->in_edges))) == 1"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x20d2,"void transform_edge_to_bb_placement(gen_ctx_t)");
code_r0x0015c00b:
  if (gen_ctx->optimize_level == 0) {
    uVar63 = *(int *)&pMVar39->field_0x18 - 0xa7;
    pMVar29 = pMVar39;
    if ((uVar63 < 0xe) && ((0x2007U >> (uVar63 & 0x1f) & 1) != 0)) {
      pMVar29 = (MIR_insn_t)pMVar39->data;
    }
  }
  else {
    pMVar29 = (MIR_insn_t)((long)pMVar39->data + 0x30);
  }
  if ((bb_t_conflict)pMVar68->data != (bb_t_conflict)pMVar29->data) {
LAB_0015c036:
    auStack_18c._92_8_ = 0x15c03e;
    process_bb_ranges(gen_ctx,(bb_t_conflict)pMVar68->data,pMVar7,tail_insn);
    pMVar7 = pMVar39;
    gen_ctx = local_f8;
  }
  goto joined_r0x0015bfc3;
LAB_0015c295:
  uVar65 = uVar65 + 1;
  pgVar72 = (gen_ctx_t)(uVar65 * 0x40);
  pgVar73 = (gen_ctx_t)(uVar25 << 6);
  if (uVar25 == uVar65) goto LAB_0015c2c8;
  goto LAB_0015c282;
LAB_0015c988:
  pbVar49 = (bb_t)((long)&pbVar49->index + 1);
  pgVar66 = (gen_ctx_t)((long)pbVar49 * 0x40);
  if (pbVar44 == pbVar49) goto LAB_0015c9bc;
  goto LAB_0015c975;
LAB_0015ca3b:
  pgVar72 = (gen_ctx_t)local_f0->to_free;
  pbVar38 = local_c0;
  pgVar66 = local_f8;
  peVar79 = local_e0;
  if (pgVar72 == (gen_ctx_t)0x0) goto LAB_0015ca57;
  goto LAB_0015c837;
LAB_0015ccf8:
  uVar65 = (ulong)pcVar88 >> 6;
  uVar25 = pVVar45->els_num;
  bVar90 = true;
  pcVar70 = pcVar88;
  if (uVar65 < uVar25) {
    pcVar70 = (char *)(uVar25 << 6);
LAB_0015cd14:
    if ((pVVar45->varr[uVar65] == 0) ||
       (uVar59 = pVVar45->varr[uVar65] >> ((ulong)pcVar88 & 0x3f), uVar59 == 0)) goto LAB_0015cd27;
    uVar25 = uVar59 & 1;
    pcVar85 = pcVar88;
    while (uVar25 == 0) {
      pcVar85 = pcVar85 + 1;
      uVar25 = uVar59 & 2;
      uVar59 = uVar59 >> 1;
    }
    pcVar70 = pcVar85 + 1;
    bVar90 = false;
  }
LAB_0015cd5b:
  if (bVar90) goto LAB_0015ccde;
  if (pcVar85 < (char *)0x22) goto LAB_0015e54e;
  pVVar35 = pgVar66->ra_ctx->spill_els;
  if (pVVar35->varr == (spill_el_t *)0x0) goto LAB_0015e549;
  uVar25 = pVVar35->els_num + 1;
  if (pVVar35->size < uVar25) {
    sVar86 = (uVar25 >> 1) + uVar25;
    auStack_18c._92_8_ = 0x15cdaf;
    psVar34 = (spill_el_t *)realloc(pVVar35->varr,sVar86 * 0x10);
    pVVar35->varr = psVar34;
    pVVar35->size = sVar86;
    peVar51 = local_e0;
    pgVar66 = local_f8;
  }
  unaff_R13 = (gen_ctx_t)
              ((ulong)unaff_R13 & 0xffffff0000000000 | (ulong)pcVar85 & 0xffffffff | 0x100000000);
  sVar86 = pVVar35->els_num;
  psVar34 = pVVar35->varr;
  pVVar35->els_num = sVar86 + 1;
  *(gen_ctx_t *)(psVar34 + sVar86) = unaff_R13;
  psVar34[sVar86].u.e = peVar51;
  pcVar88 = pcVar70;
  goto LAB_0015ccf8;
LAB_0015cd27:
  uVar65 = uVar65 + 1;
  pcVar88 = (char *)(uVar65 * 0x40);
  if (uVar25 == uVar65) goto LAB_0015cd5b;
  goto LAB_0015cd14;
LAB_0015ce73:
  uVar65 = uVar65 + 1;
  pcVar88 = (char *)(uVar65 * 0x40);
  if (uVar25 == uVar65) goto LAB_0015cea7;
  goto LAB_0015ce60;
LAB_0015cf9d:
  uVar65 = (ulong)pcVar88 >> 6;
  uVar25 = pVVar45->els_num;
  bVar90 = true;
  pcVar70 = pcVar88;
  if (uVar65 < uVar25) {
    pcVar70 = (char *)(uVar25 << 6);
LAB_0015cfbb:
    if ((pVVar45->varr[uVar65] == 0) ||
       (uVar59 = pVVar45->varr[uVar65] >> ((ulong)pcVar88 & 0x3f), uVar59 == 0)) goto LAB_0015cfce;
    uVar25 = uVar59 & 1;
    pcVar85 = pcVar88;
    while (uVar25 == 0) {
      pcVar85 = pcVar85 + 1;
      uVar25 = uVar59 & 2;
      uVar59 = uVar59 >> 1;
    }
    pcVar70 = pcVar85 + 1;
    bVar90 = false;
  }
LAB_0015d002:
  if (bVar90) goto LAB_0015cf83;
  if (pcVar85 < (char *)0x22) {
LAB_0015e572:
    auStack_18c._92_8_ = 0x15e591;
    __assert_fail("nel > ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x205d,"void collect_spill_els(gen_ctx_t)");
  }
  pVVar35 = pgVar66->ra_ctx->spill_els;
  if (pVVar35->varr == (spill_el_t *)0x0) {
    auStack_18c._92_8_ = 0x15e572;
    reg_alloc_cold_32();
    goto LAB_0015e572;
  }
  uVar25 = pVVar35->els_num + 1;
  if (pVVar35->size < uVar25) {
    sVar86 = (uVar25 >> 1) + uVar25;
    auStack_18c._92_8_ = 0x15d051;
    psVar34 = (spill_el_t *)realloc(pVVar35->varr,sVar86 * 0x10);
    pVVar35->varr = psVar34;
    pVVar35->size = sVar86;
    pgVar66 = local_f8;
    peVar82 = local_e0;
  }
  unaff_R13 = (gen_ctx_t)((ulong)unaff_R13 & 0xffffff0000000000 | (ulong)pcVar85 & 0xffffffff);
  sVar86 = pVVar35->els_num;
  psVar34 = pVVar35->varr;
  pVVar35->els_num = sVar86 + 1;
  *(gen_ctx_t *)(psVar34 + sVar86) = unaff_R13;
  psVar34[sVar86].u.e = peVar82;
  pcVar88 = pcVar70;
  goto LAB_0015cf9d;
LAB_0015cfce:
  uVar65 = uVar65 + 1;
  pcVar88 = (char *)(uVar65 * 0x40);
  if (uVar25 == uVar65) goto LAB_0015d002;
  goto LAB_0015cfbb;
LAB_0015d0a5:
  pVVar35 = pgVar66->ra_ctx->spill_els;
  local_f0 = pgVar73;
  if (pVVar35 == (VARR_spill_el_t *)0x0) {
    auStack_18c._92_8_ = 0x15e88f;
    reg_alloc_cold_75();
LAB_0015e88f:
    auStack_18c._92_8_ = 0x15e894;
    reg_alloc_cold_74();
LAB_0015e894:
    auStack_18c._92_8_ = 0x15e89c;
    reg_alloc_cold_73();
LAB_0015e89c:
    auStack_18c._92_8_ = 0x15e8a1;
    reg_alloc_cold_72();
LAB_0015e8a1:
    auStack_18c._92_8_ = 0x15e8a6;
    reg_alloc_cold_70();
LAB_0015e8a6:
    auStack_18c._92_8_ = 0x15e8ab;
    reg_alloc_cold_4();
LAB_0015e8ab:
    auStack_18c._92_8_ = 0x15e8b0;
    reg_alloc_cold_57();
LAB_0015e8b0:
    auStack_18c._92_8_ = 0x15e8b5;
    reg_alloc_cold_55();
LAB_0015e8b5:
    auStack_18c._92_8_ = 0x15e8ba;
    reg_alloc_cold_53();
LAB_0015e8ba:
    auStack_18c._92_8_ = 0x15e8bf;
    reg_alloc_cold_54();
LAB_0015e8bf:
    auStack_18c._92_8_ = 0x15e8c4;
    reg_alloc_cold_56();
LAB_0015e8c4:
    auStack_18c._92_8_ = 0x15e8e6;
    __assert_fail("first_insn->code == MIR_LABEL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x3b9,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
  }
  local_b0 = (bitmap_t)pVVar35->varr;
  auStack_18c._92_8_ = 0x15d0dc;
  qsort(local_b0,pVVar35->els_num,0x10,spill_el_sort_cmp);
  if (((FILE *)pgVar66->debug_file != (FILE *)0x0) && (1 < pgVar66->debug_level)) {
    auStack_18c._92_8_ = 0x15d10d;
    fwrite(" Spills on edges:\n",0x12,1,(FILE *)pgVar66->debug_file);
    pVVar35 = local_f8->ra_ctx->spill_els;
    if (pVVar35 != (VARR_spill_el_t *)0x0) {
      uVar25 = 0xffffffffffffffff;
      paVar41 = (anon_union_8_2_0ec0d2a8_for_u *)&local_b0->size;
      do {
        uVar25 = uVar25 + 1;
        pgVar66 = local_f8;
        if (pVVar35->els_num <= uVar25) goto LAB_0015d1cd;
        if (*(char *)((long)paVar41 + -3) == '\0') {
LAB_0015e753:
          auStack_18c._92_8_ = 0x15e772;
          __assert_fail("spill_els_addr[i].edge_p",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x20f1,"void split(gen_ctx_t)");
        }
        pcVar85 = "spill";
        if (*(char *)((long)paVar41 + -4) == '\0') {
          pcVar85 = "restore";
        }
        pcVar88 = "end";
        if (*(char *)((long)paVar41 + -2) == '\0') {
          pcVar88 = "start";
        }
        auStack_18c._100_8_ = paVar41->e->dst->index;
        auStack_18c._92_8_ = 0x15d1ad;
        fprintf((FILE *)local_f8->debug_file,"  %s r%d on %s of edge bb%lu->bb%lu\n",pcVar85,
                (ulong)((spill_el_t *)(paVar41 + -1))->reg,pcVar88,paVar41->e->src->index);
        pVVar35 = local_f8->ra_ctx->spill_els;
        paVar41 = paVar41 + 2;
      } while (pVVar35 != (VARR_spill_el_t *)0x0);
    }
    auStack_18c._92_8_ = 0x15d1cd;
    pgVar66 = local_f8;
    reg_alloc_cold_36();
  }
LAB_0015d1cd:
  pVVar35 = pgVar66->ra_ctx->spill_els;
  if (pVVar35 == (VARR_spill_el_t *)0x0) goto LAB_0015e88f;
  if (pVVar35->els_num != 0) {
    pbVar44 = (pgVar66->curr_cfg->bbs).head;
    if (pbVar44 != (bb_t_conflict)0x0) {
      iVar57 = -1;
      do {
        pbVar44 = (pbVar44->bb_link).next;
        if (pbVar44 == (bb_t)0x0) break;
        bVar90 = iVar57 != 0;
        iVar57 = iVar57 + 1;
      } while (bVar90);
    }
    pVVar45 = pgVar66->temp_bitmap;
    pgVar72 = (gen_ctx_t)pVVar35->varr;
    for (; pbVar44 != (bb_t)0x0; pbVar44 = (pbVar44->bb_link).next) {
      pVVar33 = pbVar44->kill;
      if ((pVVar33 == (bitmap_t)0x0) || (pVVar33->varr == (bitmap_el_t *)0x0)) goto LAB_0015e6c8;
      pVVar33->els_num = 0;
      pVVar33 = pbVar44->gen;
      if ((pVVar33 == (bitmap_t)0x0) || (pVVar33->varr == (bitmap_el_t *)0x0)) goto LAB_0015e6c3;
      pVVar33->els_num = 0;
      for (peVar51 = (pbVar44->out_edges).head; peVar51 != (out_edge_t)0x0;
          peVar51 = (peVar51->out_link).next) {
        peVar51->flag1 = '\0';
        peVar51->flag2 = '\0';
      }
    }
    uVar25 = 0xffffffffffffffff;
    local_f0 = pgVar72;
    do {
      uVar25 = uVar25 + 1;
      pgVar73 = local_f0;
      if (pVVar35->els_num <= uVar25) goto LAB_0015d388;
      if (*(char *)((long)&pgVar72->ctx + 5) == '\0') {
        auStack_18c._92_8_ = 0x15e71d;
        __assert_fail("spill_els_addr[i].edge_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x209a,"void transform_edge_to_bb_placement(gen_ctx_t)");
      }
      plVar12 = *(long **)&pgVar72->optimize_level;
      bVar90 = true;
      if ((*(char *)((long)&pgVar72->ctx + 4) == '\0') &&
         (((iVar57 = (int)*(undefined8 *)(**(long **)(*plVar12 + 0x58) + 0x18),
           0xffffffd0 < iVar57 - 0xa5U || (iVar57 == 0xaa)) || (iVar57 == 0xa6)))) {
        bVar90 = iVar57 == 0x76;
      }
      *(bool *)((long)plVar12 + 0x32) = bVar90;
      *(undefined1 *)((long)plVar12 + 0x33) = 1;
      pVVar33 = *(bitmap_t *)(*plVar12 + 0x80);
      uVar63 = *(uint *)&pgVar72->ctx;
      auStack_18c._92_8_ = 0x15d301;
      bitmap_expand(pVVar33,(ulong)uVar63 + 1);
      if (pVVar33 == (bitmap_t)0x0) {
        auStack_18c._92_8_ = 0x15e722;
        reg_alloc_cold_67();
LAB_0015e722:
        auStack_18c._92_8_ = 0x15e727;
        reg_alloc_cold_66();
        goto LAB_0015e727;
      }
      pVVar33->varr[uVar63 >> 6] = pVVar33->varr[uVar63 >> 6] | 1L << ((ulong)uVar63 & 0x3f);
      pVVar33 = *(bitmap_t *)(plVar12[1] + 0x78);
      uVar63 = *(uint *)&pgVar72->ctx;
      auStack_18c._92_8_ = 0x15d342;
      bitmap_expand(pVVar33,(ulong)uVar63 + 1);
      pgVar73 = local_f0;
      if (pVVar33 == (bitmap_t)0x0) goto LAB_0015e722;
      pgVar72 = (gen_ctx_t)&pgVar72->curr_func_item;
      pVVar33->varr[uVar63 >> 6] = pVVar33->varr[uVar63 >> 6] | 1L << ((ulong)uVar63 & 0x3f);
      pVVar35 = local_f8->ra_ctx->spill_els;
      pgVar66 = local_f8;
    } while (pVVar35 != (VARR_spill_el_t *)0x0);
    auStack_18c._92_8_ = 0x15d388;
    reg_alloc_cold_65();
LAB_0015d388:
    pVVar35 = pgVar66->ra_ctx->spill_els;
    if (pVVar35 != (VARR_spill_el_t *)0x0) {
      uVar25 = 0;
      do {
        uVar65 = pVVar35->els_num;
        if (uVar65 <= uVar25) goto LAB_0015d615;
        if ((pVVar45 == (bitmap_t)0x0) || (pVVar45->varr == (bitmap_el_t *)0x0)) goto LAB_0015e695;
        plVar12 = *(long **)((long)&pgVar73->optimize_level + uVar25 * 2 * 8);
        pVVar45->els_num = 0;
        pVVar35 = pgVar66->ra_ctx->spill_els;
        while( true ) {
          if (pVVar35 == (VARR_spill_el_t *)0x0) {
            auStack_18c._92_8_ = 0x15e644;
            reg_alloc_cold_62();
            goto LAB_0015e644;
          }
          if ((pVVar35->els_num <= uVar25) ||
             (plVar12 != *(long **)((long)&pgVar73->optimize_level + uVar25 * 2 * 8))) break;
          uVar63 = *(uint *)(pgVar73->call_used_hard_regs + uVar25 * 2 + -0xd);
          uVar65 = (ulong)uVar63 + 0x40 >> 6;
          lVar84 = uVar65 - pVVar45->els_num;
          if (pVVar45->els_num <= uVar65 && lVar84 != 0) {
            do {
              if (pVVar45->varr == (bitmap_el_t *)0x0) goto LAB_0015e544;
              uVar65 = pVVar45->els_num + 1;
              if (pVVar45->size < uVar65) {
                sVar86 = (uVar65 >> 1) + uVar65;
                auStack_18c._92_8_ = 0x15d448;
                pbVar36 = (bitmap_el_t *)realloc(pVVar45->varr,sVar86 * 8);
                pVVar45->varr = pbVar36;
                pVVar45->size = sVar86;
                pgVar66 = local_f8;
              }
              sVar86 = pVVar45->els_num;
              pVVar45->els_num = sVar86 + 1;
              pVVar45->varr[sVar86] = 0;
              lVar84 = lVar84 + -1;
            } while (lVar84 != 0);
          }
          pVVar45->varr[uVar63 >> 6] = pVVar45->varr[uVar63 >> 6] | 1L << ((ulong)uVar63 & 0x3f);
          uVar25 = uVar25 + 1;
          pVVar35 = pgVar66->ra_ctx->spill_els;
          pgVar73 = local_f0;
        }
        if (*(char *)((long)plVar12 + 0x32) != '\0') {
          lVar84 = *(long *)(*plVar12 + 0x40);
          for (lVar83 = lVar84; lVar83 != 0; lVar83 = *(long *)(lVar83 + 0x28)) {
            if (*(char *)(lVar83 + 0x32) == '\0') goto LAB_0015d553;
          }
          pVVar33 = *(bitmap_t *)(*plVar12 + 0x80);
          if (pVVar33 != (bitmap_t)0x0) {
            peVar79 = (in_edge_t)pVVar45->els_num;
            local_e0 = (in_edge_t)pVVar33->els_num;
            pVVar37 = pVVar45;
            peVar62 = peVar79;
            if (local_e0 < peVar79) {
              pVVar37 = pVVar33;
              pVVar33 = pVVar45;
              peVar62 = local_e0;
              local_e0 = peVar79;
            }
            pbVar36 = pVVar33->varr;
            auStack_18c._92_8_ = 0x15d524;
            iVar57 = bcmp(pVVar37->varr,pbVar36,(long)peVar62 * 8);
            pgVar66 = local_f8;
            if (iVar57 == 0) {
              if (peVar62 < local_e0) {
                do {
                  if (pbVar36[(long)peVar62] != 0) goto LAB_0015d553;
                  peVar62 = (in_edge_t)((long)&peVar62->src + 1);
                } while (local_e0 != peVar62);
              }
            }
            else {
LAB_0015d553:
              for (; lVar84 != 0; lVar84 = *(long *)(lVar84 + 0x28)) {
                *(undefined1 *)(lVar84 + 0x32) = 0;
              }
            }
            goto LAB_0015d558;
          }
          auStack_18c._92_8_ = 0x15e796;
          reg_alloc_cold_59();
LAB_0015e796:
          auStack_18c._92_8_ = 0x15e79b;
          reg_alloc_cold_60();
          goto LAB_0015e79b;
        }
LAB_0015d558:
        if (*(char *)((long)plVar12 + 0x33) != '\0') {
          lVar84 = *(long *)(plVar12[1] + 0x30);
          for (lVar83 = lVar84; lVar83 != 0; lVar83 = *(long *)(lVar83 + 0x18)) {
            if (*(char *)(lVar83 + 0x33) == '\0') goto LAB_0015d5ef;
          }
          pVVar33 = *(bitmap_t *)(plVar12[1] + 0x78);
          if (pVVar33 == (bitmap_t)0x0) goto LAB_0015e796;
          uVar65 = pVVar45->els_num;
          uVar59 = pVVar33->els_num;
          pVVar37 = pVVar45;
          uVar67 = uVar65;
          if (uVar59 < uVar65) {
            pVVar37 = pVVar33;
            pVVar33 = pVVar45;
            uVar67 = uVar59;
            uVar59 = uVar65;
          }
          pbVar36 = pVVar33->varr;
          auStack_18c._92_8_ = 0x15d5c5;
          iVar57 = bcmp(pVVar37->varr,pbVar36,uVar67 * 8);
          pgVar66 = local_f8;
          if (iVar57 == 0) {
            if (uVar67 < uVar59) {
              do {
                if (pbVar36[uVar67] != 0) goto LAB_0015d5ef;
                uVar67 = uVar67 + 1;
              } while (uVar59 != uVar67);
            }
          }
          else {
LAB_0015d5ef:
            for (; lVar84 != 0; lVar84 = *(long *)(lVar84 + 0x18)) {
              *(undefined1 *)(lVar84 + 0x33) = 0;
            }
          }
        }
        pVVar35 = pgVar66->ra_ctx->spill_els;
        pgVar73 = local_f0;
      } while (pVVar35 != (VARR_spill_el_t *)0x0);
    }
    auStack_18c._92_8_ = 0x15d615;
    reg_alloc_cold_64();
    uVar65 = extraout_RAX;
LAB_0015d615:
    if (uVar65 != 0) {
      psVar50 = (size_t *)&pgVar73->optimize_level;
      do {
        plVar12 = (long *)*psVar50;
        if ((*(char *)((long)plVar12 + 0x32) != '\0') && (*(char *)((long)plVar12 + 0x33) != '\0'))
        {
          if (*(long *)(*plVar12 + 0x40) == *(long *)(*plVar12 + 0x48)) {
            *(undefined1 *)((long)plVar12 + 0x32) = 0;
          }
          else if (*(long *)(plVar12[1] + 0x30) == *(long *)(plVar12[1] + 0x38)) {
            *(undefined1 *)((long)plVar12 + 0x33) = 0;
          }
        }
        psVar50 = psVar50 + 2;
        uVar65 = uVar65 - 1;
      } while (uVar65 != 0);
    }
    pVVar35 = pgVar66->ra_ctx->spill_els;
    if (pVVar35 != (VARR_spill_el_t *)0x0) {
      local_e0 = (in_edge_t)(ulong)pgVar66->curr_bb_index;
      uVar25 = 0;
      do {
        if (pVVar35->els_num <= uVar25) goto LAB_0015e268;
        if (((undefined1 *)((long)&pgVar73->ctx + 5))[uVar25 * 0x10] == '\0') {
LAB_0015e727:
          auStack_18c._92_8_ = 0x15e749;
          __assert_fail("spill_els_addr[n].edge_p",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x20c3,"void transform_edge_to_bb_placement(gen_ctx_t)");
        }
        ppVVar89 = pgVar73->call_used_hard_regs + uVar25 * 2 + -0xd;
        peVar79 = (in_edge_t)ppVVar89[1];
        *(undefined2 *)((long)ppVVar89 + 5) = 0;
        if (peVar79->flag1 == '\0') {
          if (peVar79->flag2 == '\0') {
            pbVar44 = peVar79->src;
            if ((in_edge_t)pbVar44->index < local_e0) {
              pbVar44 = peVar79->dst;
              if ((in_edge_t)pbVar44->index < local_e0) {
                local_c8 = pgVar66->ctx;
                pbVar38 = peVar79->src;
                local_e8 = peVar79->dst;
                pbVar55 = (pbVar38->bb_insns).tail;
                pbVar46 = (local_e8->bb_insns).head;
                local_c0 = (bb_t_conflict)pbVar55->insn;
                pbVar40 = (bb_t_conflict)pbVar46->insn;
                if (((FILE *)pgVar66->debug_file != (FILE *)0x0) && (3 < pgVar66->debug_level)) {
                  auStack_18c._92_8_ = 0x15d754;
                  local_d8 = pbVar40;
                  local_a8 = pbVar55;
                  fprintf((FILE *)pgVar66->debug_file,"    Splitting bb%lu->bb%lu:\n",pbVar38->index
                          ,local_e8->index);
                  pbVar55 = local_a8;
                  pgVar66 = local_f8;
                  pbVar40 = local_d8;
                }
                pMVar11 = local_c8;
                pbVar42 = local_e8;
                if (((pbVar38->out_edges).head == (pbVar38->out_edges).tail) ||
                   (peVar79->fall_through_p != '\0')) {
                  if (peVar79->fall_through_p == '\0') {
                    if ((pbVar38->in_edges).head == (pbVar38->in_edges).tail) goto LAB_0015e1d8;
                    iVar57 = (int)local_c0->bfs;
                    if ((1 < iVar57 - 0xabU) && (iVar57 != 0x76)) {
                      auStack_18c._92_8_ = 0x15e953;
                      local_d8 = pbVar38;
                      __assert_fail("last_insn->code == MIR_JMP || last_insn->code == MIR_RET || last_insn->code == MIR_JRET"
                                    ,
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x392,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                    }
                    auStack_18c._92_8_ = 0x15d8ca;
                    local_d8 = pbVar38;
                    delete_bb_insn(pgVar66,pbVar55);
                  }
                  else {
                    auStack_18c._92_8_ = 0x15d7ac;
                    local_d8 = pbVar38;
                    pbVar38 = (bb_t_conflict)MIR_new_insn_arr(local_c8,MIR_USE,0,(MIR_op_t *)0x0);
                    auStack_18c._92_8_ = 0x15d7c5;
                    MIR_insert_insn_after
                              (local_c8,pgVar66->curr_func_item,(MIR_insn_t_conflict)local_c0,
                               (MIR_insn_t_conflict)pbVar38);
                    local_c0 = pbVar38;
                  }
                  auStack_18c._92_8_ = 0x15d8dc;
                  pbVar38 = create_bb(pgVar66,(MIR_insn_t)local_c0);
                  auStack_18c._92_8_ = 0x15d8ef;
                  insert_new_bb_after(pgVar66,local_d8,pbVar38);
                  if (peVar79 == (in_edge_t)0x0) goto LAB_0015e8ab;
                  peVar62 = (peVar79->in_link).prev;
                  if (peVar62 == (in_edge_t)0x0) {
                    if ((local_e8->in_edges).head != peVar79) goto LAB_0015e8b5;
                    (local_e8->in_edges).head = (peVar79->in_link).next;
                  }
                  else {
                    (peVar62->in_link).next = (peVar79->in_link).next;
                  }
                  peVar13 = (peVar79->in_link).next;
                  if (peVar13 == (in_edge_t)0x0) {
                    if ((local_e8->in_edges).tail != peVar79) goto LAB_0015e8ba;
                    pDVar53 = (DLIST_LINK_in_edge_t *)&(local_e8->in_edges).tail;
                  }
                  else {
                    pDVar53 = &peVar13->in_link;
                  }
                  pDVar53->prev = peVar62;
                  (peVar79->in_link).prev = (in_edge_t)0x0;
                  (peVar79->in_link).next = (in_edge_t)0x0;
                  peVar79->dst = pbVar38;
                  peVar52 = (pbVar38->in_edges).tail;
                  if (peVar52 == (in_edge_t_conflict)0x0) {
                    if ((pbVar38->in_edges).head != (in_edge_t_conflict)0x0) goto LAB_0015e8bf;
                    pDVar54 = &pbVar38->in_edges;
                  }
                  else {
                    if ((peVar52->in_link).next != (in_edge_t)0x0) goto LAB_0015e8b0;
                    pDVar54 = (DLIST_in_edge_t *)&(peVar52->in_link).next;
                  }
                  pDVar54->head = peVar79;
                  (peVar79->in_link).next = (in_edge_t)0x0;
                  (peVar79->in_link).prev = peVar52;
                  (pbVar38->in_edges).tail = peVar79;
                  auStack_18c._92_8_ = 0x15d9a9;
                  create_edge(local_f8,pbVar38,local_e8,(uint)peVar79->fall_through_p,1);
                  peVar79->fall_through_p = '\x01';
                  pgVar66 = local_f8;
                  if (((FILE *)local_f8->debug_file != (FILE *)0x0) && (3 < local_f8->debug_level))
                  {
                    auStack_18c._92_8_ = 0x15d9e4;
                    fprintf((FILE *)local_f8->debug_file,
                            "     creating fall through bb%lu after bb%lu, redirect the edge to it",
                            pbVar38->index,(void *)local_d8->index);
                    auStack_18c._92_8_ = 0x15da06;
                    fprintf((FILE *)local_f8->debug_file,", and create edge bb%lu->bb%lu:\n",
                            pbVar38->index,local_e8->index);
                    auStack_18c._92_8_ = 0x15da25;
                    fwrite("       new bb insn is ",0x16,1,(FILE *)local_f8->debug_file);
                    pbVar40 = local_c0;
                    goto LAB_0015da2a;
                  }
                }
                else {
                  peVar62 = (local_e8->in_edges).head;
                  local_a0 = (DLIST_LINK_in_edge_t *)&(local_e8->in_edges).tail;
                  iVar57 = (int)pbVar40->bfs;
                  if (peVar62 == (local_e8->in_edges).tail) {
                    if (iVar57 != 0xb4) goto LAB_0015e90f;
                    pbVar38 = local_e8;
                    if (pbVar46 == (local_e8->bb_insns).tail) goto LAB_0015e1d8;
                    auStack_18c._92_8_ = 0x15daf3;
                    delete_bb_insn(pgVar66,pbVar46);
                    auStack_18c._92_8_ = 0x15db05;
                    local_d8 = pbVar40;
                    pbVar38 = create_bb(local_f8,(MIR_insn_t)pbVar40);
                    auStack_18c._92_8_ = 0x15db23;
                    DLIST_bb_t_insert_before(&local_f8->curr_cfg->bbs,pbVar42,pbVar38);
                    uVar63 = local_f8->curr_bb_index;
                    local_f8->curr_bb_index = uVar63 + 1;
                    pbVar38->index = (ulong)uVar63;
                    if (peVar79 == (in_edge_t)0x0) {
                      auStack_18c._92_8_ = 0x15e958;
                      reg_alloc_cold_52();
                      goto LAB_0015e958;
                    }
                    peVar62 = (peVar79->in_link).prev;
                    if (peVar62 == (in_edge_t)0x0) {
                      if ((local_e8->in_edges).head == peVar79) {
                        (local_e8->in_edges).head = (peVar79->in_link).next;
                        goto LAB_0015dc64;
                      }
LAB_0015e993:
                      auStack_18c._92_8_ = 0x15e998;
                      reg_alloc_cold_48();
LAB_0015e998:
                      auStack_18c._92_8_ = 0x15e99d;
                      reg_alloc_cold_49();
LAB_0015e99d:
                      auStack_18c._92_8_ = 0x15e9a2;
                      reg_alloc_cold_51();
LAB_0015e9a2:
                      auStack_18c._92_8_ = 0x15e9c1;
                      __assert_fail("!MIR_any_branch_code_p (tail_insn->code)",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x3c5,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                    }
                    (peVar62->in_link).next = (peVar79->in_link).next;
LAB_0015dc64:
                    peVar13 = (peVar79->in_link).next;
                    if (peVar13 == (in_edge_t)0x0) {
                      pDVar53 = local_a0;
                      if (local_a0->prev == peVar79) goto LAB_0015dc7f;
                      goto LAB_0015e998;
                    }
                    pDVar53 = &peVar13->in_link;
LAB_0015dc7f:
                    pDVar53->prev = peVar62;
                    (peVar79->in_link).prev = (in_edge_t)0x0;
                    (peVar79->in_link).next = (in_edge_t)0x0;
                    peVar79->dst = pbVar38;
                    peVar62 = (pbVar38->in_edges).tail;
                    if (peVar62 == (in_edge_t)0x0) {
                      if ((pbVar38->in_edges).head != (in_edge_t_conflict)0x0) goto LAB_0015e99d;
                      pDVar54 = &pbVar38->in_edges;
                    }
                    else {
                      if ((peVar62->in_link).next != (in_edge_t)0x0) {
                        auStack_18c._92_8_ = 0x15e98e;
                        reg_alloc_cold_50();
LAB_0015e98e:
                        auStack_18c._92_8_ = 0x15e993;
                        reg_alloc_cold_41();
                        goto LAB_0015e993;
                      }
                      pDVar54 = (DLIST_in_edge_t *)&(peVar62->in_link).next;
                    }
                    pDVar54->head = peVar79;
                    (peVar79->in_link).next = (in_edge_t)0x0;
                    (peVar79->in_link).prev = peVar62;
                    (pbVar38->in_edges).tail = peVar79;
                    auStack_18c._92_8_ = 0x15dce4;
                    create_edge(local_f8,pbVar38,local_e8,1,1);
                    pbVar40 = local_e8;
                    pgVar66 = local_f8;
                    if (((FILE *)local_f8->debug_file == (FILE *)0x0) || (local_f8->debug_level < 4)
                       ) goto LAB_0015e1d8;
                    auStack_18c._92_8_ = 0x15dd1b;
                    fprintf((FILE *)local_f8->debug_file,
                            "     creating bb%lu before bb%lu, redirect the edge to it",
                            pbVar38->index,local_e8->index);
                    auStack_18c._92_8_ = 0x15dd39;
                    fprintf((FILE *)local_f8->debug_file,
                            ", and create fall-through edge bb%lu->bb%lu:\n",pbVar38->index,
                            pbVar40->index);
                    auStack_18c._92_8_ = 0x15dd58;
                    fwrite("       new bb insn is ",0x16,1,(FILE *)local_f8->debug_file);
                    pbVar40 = local_d8;
LAB_0015da2a:
                    pbVar46 = (bb_insn_t_conflict)pbVar40->index;
                  }
                  else {
                    local_d8 = pbVar40;
                    local_a8 = pbVar55;
                    if (iVar57 != 0xb4) goto LAB_0015e8c4;
                    for (; peVar62 != (in_edge_t)0x0; peVar62 = (peVar62->in_link).next) {
                      if (peVar62->fall_through_p != '\0') {
                        if (peVar62->dst != local_e8) goto LAB_0015e967;
                        auStack_18c._92_8_ = 0x15db94;
                        MIR_new_label_op(local_c8,(MIR_label_t)pbVar40);
                        uStack_108 = local_98[1].live;
                        uStack_100 = local_98[1].regs_to_save;
                        auStack_18c._100_8_ = local_98[0].bb;
                        pVStack_120 = local_98[0].live;
                        peStack_118 = (in_edge_t)local_98[0].regs_to_save;
                        uStack_110 = local_98[1].bb;
                        auStack_18c._92_8_ = 0x15dbc3;
                        pMVar39 = MIR_new_insn(pMVar11,MIR_JMP);
                        pgVar66 = local_f8;
                        pMVar7 = ((peVar62->src->bb_insns).tail)->insn;
                        local_b8 = pMVar39;
                        if (((peVar62->out_link).next == (out_edge_t)0x0) &&
                           ((peVar62->out_link).prev == (out_edge_t)0x0)) {
                          iVar57 = (int)*(undefined8 *)&pMVar7->field_0x18;
                          if (((0xffffffd0 < iVar57 - 0xa5U) || (iVar57 == 0xaa)) ||
                             (iVar57 == 0xa6)) goto LAB_0015e9a2;
                          auStack_18c._92_8_ = 0x15e21c;
                          gen_add_insn_after(local_f8,pMVar7,pMVar39);
                          pgVar66 = local_f8;
                          peVar62->fall_through_p = '\0';
                          if (((FILE *)local_f8->debug_file == (FILE *)0x0) ||
                             (local_f8->debug_level < 4)) break;
                          sVar86 = peVar62->src->index;
                          auStack_18c._92_8_ = 0x15e263;
                          fprintf((FILE *)local_f8->debug_file,
                                  "     Make edge bb%lu->bb%lu a non-fall through, add new insn at the of bb%lu "
                                  ,sVar86,peVar62->dst->index,sVar86);
                        }
                        else {
                          auStack_18c._92_8_ = 0x15dbfc;
                          MIR_insert_insn_after(pMVar11,local_f8->curr_func_item,pMVar7,pMVar39);
                          auStack_18c._92_8_ = 0x15dc07;
                          pbVar40 = create_bb(pgVar66,pMVar39);
                          pbVar38 = peVar62->src;
                          auStack_18c._92_8_ = 0x15dc18;
                          pgVar72 = pgVar66;
                          insert_new_bb_after(pgVar66,pbVar38,pbVar40);
                          pgVar73 = local_f0;
                          pbVar44 = peVar62->dst;
                          peVar13 = (peVar62->in_link).prev;
                          if (peVar13 == (in_edge_t)0x0) {
                            if ((pbVar44->in_edges).head == peVar62) {
                              (pbVar44->in_edges).head = (peVar62->in_link).next;
                              goto LAB_0015dd83;
                            }
                            auStack_18c._92_8_ = 0x15e9c6;
                            reg_alloc_cold_39();
LAB_0015e9c6:
                            auStack_18c._92_8_ = 0x15e9cb;
                            reg_alloc_cold_40();
LAB_0015e9cb:
                            auStack_18c._92_8_ = add_bb_insn_dead_vars;
                            reg_alloc_cold_42();
                            auStack_18c._52_8_ = peVar62;
                            auStack_18c._60_8_ = pgVar66;
                            auStack_18c._68_8_ = peVar79;
                            auStack_18c._76_8_ = pbVar40;
                            auStack_18c._84_8_ = ppVVar89;
                            auStack_18c._92_8_ = uVar25;
                            if (pgVar72->optimize_level == 0) {
LAB_0015ee99:
                              __assert_fail("gen_ctx->optimize_level > 0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                            ,0x1802,"void add_bb_insn_dead_vars(gen_ctx_t)");
                            }
                            pbVar42 = (bb_t_conflict)malloc(0x18);
                            pbVar42->index = 0;
                            pbVar42->pre = 4;
                            pvVar43 = malloc(0x20);
                            pbVar42->rpost = (size_t)pvVar43;
                            pbVar40 = (pgVar72->curr_cfg->bbs).head;
                            if (pbVar40 != (bb_t_conflict)0x0) {
                              auStack_18c._36_8_ = &pgVar72->free_dead_vars;
                              auStack_18c._20_8_ = &(pgVar72->free_dead_vars).tail;
                              pbStack_1a0 = pbVar42;
                              do {
                                pbVar38 = (bb_t_conflict)pbVar40->out;
                                bitmap_copy((bitmap_t)pbVar42,(const_bitmap_t)pbVar38);
                                bb_insn = (bb_t_conflict)(pbVar40->bb_insns).tail;
                                auStack_18c._12_8_ = pbVar40;
                                while (bb_insn != (bb_t_conflict)0x0) {
                                  auStack_18c._28_8_ = (bb_insn->bb_link).prev;
                                  pbVar38 = bb_insn;
                                  clear_bb_insn_dead_vars(pgVar72,(bb_insn_t_conflict)bb_insn);
                                  pbStack_1b0 = (bb_t_conflict)bb_insn->index;
                                  uVar65 = (ulong)*(uint *)((long)&pbStack_1b0->bfs + 4);
                                  pDStack_198 = &pbStack_1b0->in_edges;
                                  sVar86 = 0;
                                  pbStack_1a8 = bb_insn;
LAB_0015ea9d:
                                  bVar90 = true;
                                  if (sVar86 < uVar65) {
                                    pDVar54 = pDStack_198 + sVar86 * 3;
                                    do {
                                      pbVar38 = pbStack_1b0;
                                      MIR_insn_op_mode(pgVar72->ctx,(MIR_insn_t_conflict)pbStack_1b0
                                                       ,sVar86,&iStack_1b4);
                                      pbVar42 = pbStack_1a0;
                                      if ((iStack_1b4 != 0) &&
                                         (*(char *)&((DLIST_LINK_bb_t *)(pDVar54 + -1))->next !=
                                          '\v')) {
                                        if (*(char *)&((DLIST_LINK_bb_t *)(pDVar54 + -1))->next !=
                                            '\x02') {
                                          __assert_fail("op_ref->mode == MIR_OP_VAR",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                                  ,0x4ff,
                                                  "int output_insn_var_iterator_next(gen_ctx_t, insn_var_iterator_t *, MIR_reg_t *, int *)"
                                                  );
                                        }
                                        uVar25 = (ulong)*(uint *)&pDVar54->head;
                                        sVar86 = sVar86 + 1;
                                        bVar90 = false;
                                        goto LAB_0015eb00;
                                      }
                                      sVar86 = sVar86 + 1;
                                      pDVar54 = pDVar54 + 3;
                                    } while (uVar65 != sVar86);
                                    bVar90 = true;
                                  }
LAB_0015eb00:
                                  if (!bVar90) {
                                    pbVar38 = (bb_t_conflict)(uVar25 & 0xffffffff);
                                    uVar63 = var_to_scan_var(pgVar72,(MIR_reg_t)uVar25);
                                    if ((-1 < (int)uVar63) && ((ulong)uVar63 < pbVar42->index << 6))
                                    {
                                      bVar15 = (byte)uVar63 & 0x3f;
                                      pbVar38 = (bb_t_conflict)
                                                (-2L << bVar15 |
                                                0xfffffffffffffffeU >> 0x40 - bVar15);
                                      puVar2 = (ulong *)(pbVar42->rpost + (ulong)(uVar63 >> 6) * 8);
                                      *puVar2 = *puVar2 & (ulong)pbVar38;
                                    }
                                    goto LAB_0015ea9d;
                                  }
                                  if ((pgVar72->lr_ctx->scan_vars_num == 0) &&
                                     (0xfffffffc < (int)pbStack_1b0->bfs - 0xaaU)) {
                                    bitmap_and_compl((bitmap_t)pbVar42,(bitmap_t)pbVar42,
                                                     pgVar72->call_used_hard_regs[0x12]);
                                    pbVar38 = pbVar42;
                                  }
                                  pDStack_198 = (DLIST_in_edge_t *)
                                                (ulong)*(uint *)((long)&pbStack_1b0->bfs + 4);
                                  auStack_18c._44_8_ = &pbStack_1b0->bb_link;
                                  auStack_18c._4_8_ = &(pbStack_1a8->in_edges).tail;
                                  uVar59 = 0;
                                  uVar65 = 0;
LAB_0015eb9d:
                                  bVar90 = true;
                                  uVar67 = uVar65;
                                  if (uVar59 < pDStack_198) {
                                    do {
                                      pbVar38 = pbStack_1b0;
                                      MIR_insn_op_mode(pgVar72->ctx,(MIR_insn_t_conflict)pbStack_1b0
                                                       ,uVar59,&iStack_1b4);
                                      if ((iStack_1b4 == 0) ||
                                         (uVar65 = uVar67,
                                         *(char *)&((DLIST_LINK_bb_t *)
                                                   (auStack_18c._44_8_ + uVar59 * 3 * 0x10))->next
                                         == '\v')) {
                                        if (uVar67 < 2) {
                                          while (*(char *)&((DLIST_LINK_bb_t *)
                                                           (auStack_18c._44_8_ + uVar59 * 3 * 0x10))
                                                           ->next == '\v') {
                                            pbVar38 = (bb_t_conflict)(ulong)(uVar67 != 0);
                                            uVar63 = *(uint *)((long)&((DLIST_LINK_bb_t *)
                                                                      (auStack_18c._44_8_ +
                                                                      (uVar59 * 3 + 2) * 0x10))->
                                                                      prev + (long)pbVar38 * 4);
                                            uVar25 = (ulong)uVar63;
                                            if (uVar63 != 0xffffffff) goto LAB_0015ec2f;
                                            if (uVar67 != 0) goto LAB_0015ec1d;
                                            uVar67 = 1;
                                          }
                                          if (uVar67 != 1) {
                                            uVar65 = 0;
                                            if (*(char *)&((DLIST_LINK_bb_t *)
                                                          (auStack_18c._44_8_ + uVar59 * 3 * 0x10))
                                                          ->next != '\x02') goto LAB_0015ec20;
                                            uVar25 = (ulong)*(uint *)&((DLIST_LINK_bb_t *)
                                                                      (auStack_18c._44_8_ +
                                                                      (uVar59 * 3 + 1) * 0x10))->
                                                                      prev;
LAB_0015ec2f:
                                            uVar65 = uVar67 + 1;
                                            bVar90 = false;
                                            break;
                                          }
                                        }
LAB_0015ec1d:
                                        uVar65 = 0;
                                      }
LAB_0015ec20:
                                      uVar59 = uVar59 + 1;
                                      uVar67 = uVar65;
                                    } while ((DLIST_in_edge_t *)uVar59 != pDStack_198);
                                  }
                                  pbVar42 = pbStack_1a0;
                                  if (!bVar90) {
                                    MVar64 = (MIR_reg_t)uVar25;
                                    pbVar38 = (bb_t_conflict)(uVar25 & 0xffffffff);
                                    uVar63 = var_to_scan_var(pgVar72,MVar64);
                                    pbVar40 = pbStack_1a0;
                                    if (-1 < (int)uVar63) {
                                      bitmap_expand((bitmap_t)pbStack_1a0,(ulong)uVar63 + 1);
                                      uVar67 = *(ulong *)(pbVar40->rpost + (ulong)(uVar63 >> 6) * 8)
                                      ;
                                      pbVar38 = (bb_t_conflict)
                                                (uVar67 | 1L << ((ulong)uVar63 & 0x3f));
                                      *(bb_t_conflict *)(pbVar40->rpost + (ulong)(uVar63 >> 6) * 8)
                                           = pbVar38;
                                      if ((uVar67 >> ((ulong)uVar63 & 0x3f) & 1) == 0) {
                                        for (peVar79 = *(in_edge_t *)auStack_18c._4_8_;
                                            peVar79 != (in_edge_t)0x0;
                                            peVar79 = (peVar79->in_link).prev) {
                                          if (*(MIR_reg_t *)&peVar79->src == MVar64)
                                          goto LAB_0015eb9d;
                                        }
                                        pbVar44 = (bb_t)*(dead_var_t_conflict *)auStack_18c._36_8_;
                                        if (pbVar44 != (bb_t)0x0) {
                                          pbVar49 = (bb_t)pbVar44->pre;
                                          pDVar71 = (DLIST_dead_var_t *)&pbVar49->rpost;
                                          if (pbVar49 == (bb_t)0x0) {
                                            pDVar71 = (DLIST_dead_var_t *)auStack_18c._36_8_;
                                          }
                                          pDVar71->head =
                                               (dead_var_t_conflict)
                                               ((DLIST_LINK_in_edge_t *)&pbVar44->rpost)->prev;
                                          peVar79 = ((DLIST_LINK_in_edge_t *)&pbVar44->rpost)->prev;
                                          if (peVar79 != (in_edge_t)0x0) {
                                            ppbVar56 = &peVar79->dst;
LAB_0015ed0b:
                                            pbVar38 = (bb_t_conflict)&pbVar44->pre;
                                            *ppbVar56 = pbVar49;
                                            *(size_t *)pbVar38 = 0;
                                            pbVar44->rpost = 0;
                                            goto LAB_0015ed1a;
                                          }
                                          ppbVar56 = (bb_t *)auStack_18c._20_8_;
                                          if (*(bb_t *)auStack_18c._20_8_ == pbVar44)
                                          goto LAB_0015ed0b;
LAB_0015ee94:
                                          add_bb_insn_dead_vars_cold_1();
                                          goto LAB_0015ee99;
                                        }
                                        pbVar44 = (bb_t)malloc(0x18);
                                        if (pbVar44 == (bb_t)0x0) goto LAB_0015ee80;
LAB_0015ed1a:
                                        *(MIR_reg_t *)&pbVar44->index = MVar64;
                                        pbVar49 = (bb_t)(pbStack_1a8->out_edges).head;
                                        if (pbVar49 == (bb_t)0x0) {
                                          pDVar53 = (DLIST_LINK_in_edge_t *)auStack_18c._4_8_;
                                          if (*(in_edge_t *)auStack_18c._4_8_ != (in_edge_t)0x0) {
                                            add_bb_insn_dead_vars_cold_3();
                                            goto LAB_0015ee94;
                                          }
                                        }
                                        else {
                                          if (((DLIST_LINK_in_edge_t *)&pbVar49->rpost)->prev !=
                                              (in_edge_t)0x0) {
                                            add_bb_insn_dead_vars_cold_2();
LAB_0015ee80:
                                            util_error(pgVar72,"no memory");
                                          }
                                          pDVar53 = (DLIST_LINK_in_edge_t *)&pbVar49->rpost;
                                        }
                                        pDVar53->prev = (in_edge_t)pbVar44;
                                        ((DLIST_LINK_in_edge_t *)&pbVar44->rpost)->prev =
                                             (in_edge_t)0x0;
                                        pbVar44->pre = (size_t)pbVar49;
                                        (pbStack_1a8->out_edges).head = (out_edge_t)pbVar44;
                                      }
                                    }
                                    goto LAB_0015eb9d;
                                  }
                                  bb_insn = (bb_t_conflict)auStack_18c._28_8_;
                                  if (pgVar72->lr_ctx->scan_vars_num == 0) {
                                    pbVar38 = (bb_t_conflict)auStack_18c;
                                    target_get_early_clobbered_hard_regs
                                              ((MIR_insn_t)pbStack_1b0,(MIR_reg_t *)pbVar38,
                                               &uStack_190);
                                    if (((ulong)(uint)auStack_18c._0_4_ != 0xffffffff) &&
                                       ((ulong)(uint)auStack_18c._0_4_ < pbVar42->index << 6)) {
                                      bVar15 = (byte)auStack_18c._0_4_ & 0x3f;
                                      pbVar38 = (bb_t_conflict)
                                                (-2L << bVar15 |
                                                0xfffffffffffffffeU >> 0x40 - bVar15);
                                      puVar2 = (ulong *)(pbVar42->rpost +
                                                        (ulong)((uint)auStack_18c._0_4_ >> 6) * 8);
                                      *puVar2 = *puVar2 & (ulong)pbVar38;
                                    }
                                    if (((ulong)uStack_190 != 0xffffffff) &&
                                       ((ulong)uStack_190 < pbVar42->index << 6)) {
                                      bVar15 = (byte)uStack_190 & 0x3f;
                                      pbVar38 = (bb_t_conflict)
                                                (-2L << bVar15 |
                                                0xfffffffffffffffeU >> 0x40 - bVar15);
                                      puVar2 = (ulong *)(pbVar42->rpost +
                                                        (ulong)(uStack_190 >> 6) * 8);
                                      *puVar2 = *puVar2 & (ulong)pbVar38;
                                    }
                                    bb_insn = (bb_t_conflict)auStack_18c._28_8_;
                                    if (0xfffffffc < (int)pbStack_1b0->bfs - 0xaaU) {
                                      pbVar38 = pbVar42;
                                      bitmap_ior((bitmap_t)pbVar42,(bitmap_t)pbVar42,
                                                 (bitmap_t)(pbStack_1a8->out_edges).tail);
                                      bb_insn = (bb_t_conflict)auStack_18c._28_8_;
                                    }
                                  }
                                }
                                pbVar40 = ((DLIST_LINK_bb_t *)(auStack_18c._12_8_ + 0x20))->next;
                              } while (pbVar40 != (bb_t)0x0);
                            }
                            pgVar66 = (gen_ctx_t)pbVar42->rpost;
                            if (pgVar66 != (gen_ctx_t)0x0) {
                              free(pgVar66);
                              free(pbVar42);
                              return;
                            }
                            add_bb_insn_dead_vars_cold_4();
                            if (pgVar66->lr_ctx->scan_vars_num == 0) {
                              reg_map = (MIR_reg_t *)0x0;
                            }
                            else {
                              pVVar6 = pgVar66->lr_ctx->scan_var_to_var_map;
                              if (pVVar6 == (VARR_MIR_reg_t *)0x0) {
                                output_bb_live_info_cold_1();
                                pbVar40 = (bb_t_conflict)malloc(0xa8);
                                if (pbVar40 == (bb_t_conflict)0x0) {
                                  util_error(pgVar66,"no memory");
                                }
                                pbVar40->loop_node = (loop_node_t_conflict)0x0;
                                pVVar45 = (bitmap_t)malloc(0x18);
                                pbVar40->pre = 0;
                                pbVar40->rpost = 0;
                                pbVar40->bfs = 0;
                                auVar92 = ZEXT432(0) << 0x40;
                                (pbVar40->in_edges).head =
                                     (in_edge_t_conflict)SUB168(auVar92._0_16_,0);
                                (pbVar40->in_edges).tail =
                                     (in_edge_t_conflict)SUB168(auVar92._0_16_,8);
                                (pbVar40->out_edges).head = (out_edge_t)SUB168(auVar92._16_16_,0);
                                (pbVar40->out_edges).tail = (out_edge_t)SUB168(auVar92._16_16_,8);
                                *(undefined1 (*) [32])((long)&(pbVar40->out_edges).head + 3) =
                                     auVar92;
                                pVVar45->els_num = 0;
                                pVVar45->size = 4;
                                pbVar36 = (bitmap_el_t *)malloc(0x20);
                                pVVar45->varr = pbVar36;
                                pbVar40->in = pVVar45;
                                pVVar45 = (bitmap_t)malloc(0x18);
                                pVVar45->els_num = 0;
                                pVVar45->size = 4;
                                pbVar36 = (bitmap_el_t *)malloc(0x20);
                                pVVar45->varr = pbVar36;
                                pbVar40->out = pVVar45;
                                pVVar45 = (bitmap_t)malloc(0x18);
                                pVVar45->els_num = 0;
                                pVVar45->size = 4;
                                pbVar36 = (bitmap_el_t *)malloc(0x20);
                                pVVar45->varr = pbVar36;
                                pbVar40->gen = pVVar45;
                                pVVar45 = (bitmap_t)malloc(0x18);
                                pVVar45->els_num = 0;
                                pVVar45->size = 4;
                                pbVar36 = (bitmap_el_t *)malloc(0x20);
                                pVVar45->varr = pbVar36;
                                pbVar40->kill = pVVar45;
                                pVVar45 = (bitmap_t)malloc(0x18);
                                pVVar45->els_num = 0;
                                pVVar45->size = 4;
                                pbVar36 = (bitmap_el_t *)malloc(0x20);
                                pVVar45->varr = pbVar36;
                                pbVar40->dom_in = pVVar45;
                                pVVar45 = (bitmap_t)malloc(0x18);
                                pVVar45->els_num = 0;
                                pVVar45->size = 4;
                                pbVar36 = (bitmap_el_t *)malloc(0x20);
                                pVVar45->varr = pbVar36;
                                pbVar40->dom_out = pVVar45;
                                pbVar40->max_int_pressure = 0;
                                pbVar40->max_fp_pressure = 0;
                                if (pbVar38 != (bb_t_conflict)0x0) {
                                  if (pgVar66->optimize_level == 0) {
                                    setup_insn_data(pgVar66,(MIR_insn_t)pbVar38,pbVar40);
                                  }
                                  else {
                                    pbVar46 = create_bb_insn(pgVar66,(MIR_insn_t)pbVar38,pbVar40);
                                    DLIST_bb_insn_t_append(&pbVar40->bb_insns,pbVar46);
                                  }
                                }
                                return;
                              }
                              reg_map = pVVar6->varr;
                            }
                            output_bb_border_live_info(pgVar66,pbVar38);
                            output_bitmap(pgVar66,"  live_gen:",pbVar38->gen,1,reg_map);
                            output_bitmap(pgVar66,"  live_kill:",pbVar38->kill,1,reg_map);
                            return;
                          }
                          (peVar13->in_link).next = (peVar62->in_link).next;
LAB_0015dd83:
                          peVar14 = (peVar62->in_link).next;
                          pgVar66 = local_f0;
                          pgVar72 = local_f8;
                          if (peVar14 == (in_edge_t)0x0) {
                            pbVar38 = (bb_t_conflict)0x0;
                            if ((pbVar44->in_edges).tail != peVar62) goto LAB_0015e9c6;
                            pbVar38 = (bb_t_conflict)&(pbVar44->in_edges).tail;
                          }
                          else {
                            pbVar38 = (bb_t_conflict)&peVar14->in_link;
                          }
                          pbVar38->index = (size_t)peVar13;
                          (peVar62->in_link).prev = (in_edge_t)0x0;
                          (peVar62->in_link).next = (in_edge_t)0x0;
                          peVar62->dst = pbVar40;
                          peVar52 = (pbVar40->in_edges).tail;
                          if (peVar52 == (in_edge_t_conflict)0x0) {
                            if ((pbVar40->in_edges).head != (in_edge_t_conflict)0x0)
                            goto LAB_0015e9cb;
                            pDVar54 = &pbVar40->in_edges;
                          }
                          else {
                            if ((peVar52->in_link).next != (in_edge_t)0x0) goto LAB_0015e98e;
                            pDVar54 = (DLIST_in_edge_t *)&(peVar52->in_link).next;
                          }
                          pDVar54->head = peVar62;
                          (peVar62->in_link).next = (in_edge_t)0x0;
                          (peVar62->in_link).prev = peVar52;
                          (pbVar40->in_edges).tail = peVar62;
                          auStack_18c._92_8_ = 0x15de05;
                          create_edge(local_f8,pbVar40,local_e8,0,1);
                          pbVar38 = local_e8;
                          if (((FILE *)local_f8->debug_file == (FILE *)0x0) ||
                             (local_f8->debug_level < 4)) break;
                          auStack_18c._100_8_ = pbVar40->index;
                          sVar86 = peVar62->src->index;
                          auStack_18c._92_8_ = 0x15de44;
                          fprintf((FILE *)local_f8->debug_file,
                                  "     creating bb%lu after bb%lu, redirect edge bb%lu->bb%lu to bb%lu"
                                  ,auStack_18c._100_8_,sVar86,sVar86,local_e8->index);
                          pgVar66 = local_f8;
                          auStack_18c._92_8_ = 0x15de64;
                          fprintf((FILE *)local_f8->debug_file,
                                  ", and create jump edge bb%lu->bb%lu:\n",pbVar40->index,
                                  pbVar38->index);
                          auStack_18c._92_8_ = 0x15de7e;
                          fwrite("       new bb insn is ",0x16,1,(FILE *)pgVar66->debug_file);
                        }
                        auStack_18c._92_8_ = 0x15de90;
                        print_bb_insn(pgVar66,(bb_insn_t_conflict)local_b8->data,0);
                        break;
                      }
                      pbVar55 = (peVar62->src->bb_insns).tail;
                      if ((pbVar55 == (bb_insn_t)0x0) ||
                         (((iVar57 = (int)*(undefined8 *)&pbVar55->insn->field_0x18,
                           iVar57 - 0xa5U < 0xffffffd1 && (iVar57 != 0xa6)) && (iVar57 != 0xaa))))
                      goto LAB_0015e849;
                    }
                    pMVar11 = local_c8;
                    auStack_18c._92_8_ = 0x15dea3;
                    pMVar39 = MIR_new_label(local_c8);
                    auStack_18c._92_8_ = 0x15debf;
                    MIR_insert_insn_before
                              (pMVar11,local_f8->curr_func_item,(MIR_insn_t_conflict)local_d8,
                               pMVar39);
                    auStack_18c._92_8_ = 0x15ded1;
                    local_b8 = pMVar39;
                    pbVar38 = create_bb(local_f8,pMVar39);
                    auStack_18c._92_8_ = 0x15def1;
                    DLIST_bb_t_insert_before(&local_f8->curr_cfg->bbs,local_e8,pbVar38);
                    uVar63 = local_f8->curr_bb_index;
                    local_f8->curr_bb_index = uVar63 + 1;
                    pbVar38->index = (ulong)uVar63;
                    if (peVar79 == (in_edge_t)0x0) {
                      auStack_18c._92_8_ = 0x15e8eb;
                      reg_alloc_cold_47();
                      goto LAB_0015e8eb;
                    }
                    peVar62 = (peVar79->in_link).prev;
                    if (peVar62 == (in_edge_t)0x0) {
                      if ((local_e8->in_edges).head == peVar79) {
                        (local_e8->in_edges).head = (peVar79->in_link).next;
                        goto LAB_0015df48;
                      }
LAB_0015e958:
                      auStack_18c._92_8_ = 0x15e95d;
                      reg_alloc_cold_43();
LAB_0015e95d:
                      auStack_18c._92_8_ = 0x15e962;
                      reg_alloc_cold_44();
LAB_0015e962:
                      auStack_18c._92_8_ = 0x15e967;
                      reg_alloc_cold_46();
LAB_0015e967:
                      auStack_18c._92_8_ = 0x15e989;
                      __assert_fail("e2->dst == dst",
                                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                    ,0x3c0,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                    }
                    (peVar62->in_link).next = (peVar79->in_link).next;
LAB_0015df48:
                    peVar13 = (peVar79->in_link).next;
                    if (peVar13 == (in_edge_t)0x0) {
                      pDVar53 = local_a0;
                      if (local_a0->prev != peVar79) goto LAB_0015e95d;
                    }
                    else {
                      pDVar53 = &peVar13->in_link;
                    }
                    pDVar53->prev = peVar62;
                    (peVar79->in_link).prev = (in_edge_t)0x0;
                    (peVar79->in_link).next = (in_edge_t)0x0;
                    peVar79->dst = pbVar38;
                    peVar62 = (pbVar38->in_edges).tail;
                    if (peVar62 == (in_edge_t)0x0) {
                      if ((pbVar38->in_edges).head != (in_edge_t_conflict)0x0) goto LAB_0015e962;
                      pDVar54 = &pbVar38->in_edges;
                    }
                    else {
                      if ((peVar62->in_link).next != (in_edge_t)0x0) {
                        auStack_18c._92_8_ = 0x15e90f;
                        reg_alloc_cold_45();
LAB_0015e90f:
                        auStack_18c._92_8_ = 0x15e931;
                        __assert_fail("first_insn->code == MIR_LABEL",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x3a6,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      pDVar54 = (DLIST_in_edge_t *)&(peVar62->in_link).next;
                    }
                    pDVar54->head = peVar79;
                    (peVar79->in_link).next = (in_edge_t)0x0;
                    (peVar79->in_link).prev = peVar62;
                    (pbVar38->in_edges).tail = peVar79;
                    auStack_18c._92_8_ = 0x15dfc8;
                    create_edge(local_f8,pbVar38,local_e8,1,1);
                    pbVar40 = local_e8;
                    if (((FILE *)local_f8->debug_file != (FILE *)0x0) && (3 < local_f8->debug_level)
                       ) {
                      auStack_18c._92_8_ = 0x15dffe;
                      fprintf((FILE *)local_f8->debug_file,
                              "     creating bb%lu before bb%lu, redirect the edge to it",
                              pbVar38->index,local_e8->index);
                      auStack_18c._92_8_ = 0x15e01c;
                      fprintf((FILE *)local_f8->debug_file,
                              ", and create fall-through edge bb%lu->bb%lu:\n",pbVar38->index,
                              pbVar40->index);
                      auStack_18c._92_8_ = 0x15e03b;
                      fwrite("       new bb insn is ",0x16,1,(FILE *)local_f8->debug_file);
                      auStack_18c._92_8_ = 0x15e04f;
                      print_bb_insn(local_f8,(bb_insn_t_conflict)local_b8->data,0);
                      auStack_18c._92_8_ = 0x15e06e;
                      fwrite("       change src bb insn ",0x1a,1,(FILE *)local_f8->debug_file);
                      auStack_18c._92_8_ = 0x15e082;
                      print_bb_insn(local_f8,local_a8,0);
                    }
                    pbVar40 = local_c0;
                    uVar65 = local_c0->bfs;
                    if ((int)uVar65 == 0xaa) {
                      if (uVar65 >> 0x21 == 0) {
LAB_0015e86b:
                        auStack_18c._92_8_ = 0x15e88a;
                        __assert_fail("i < last_insn->nops",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x3ff,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      if (*(bb_t_conflict *)&local_c0->call_p == local_d8) {
                        uVar59 = 1;
                        bVar90 = true;
                      }
                      else {
                        uVar59 = 1;
                        ppVVar80 = &local_c0->dom_out;
                        do {
                          if ((2 - (uVar65 >> 0x20)) + uVar59 == 1) goto LAB_0015e86b;
                          uVar59 = uVar59 + 1;
                          pbVar42 = (bb_t_conflict)*ppVVar80;
                          ppVVar80 = ppVVar80 + 6;
                        } while (pbVar42 != local_d8);
                        bVar90 = uVar59 < uVar65 >> 0x20;
                      }
                      if (!bVar90) goto LAB_0015e86b;
                      auStack_18c._92_8_ = 0x15e178;
                      MIR_new_label_op(local_c8,local_b8);
                      auVar19._16_8_ = iStack_58;
                      auVar19._0_16_ = local_68;
                      auVar19._24_8_ = pcStack_50;
                      piVar3 = (int64_t *)((long)&pbVar40->in_edges + uVar59 * 0x30);
                      *piVar3 = iStack_58;
                      piVar3[1] = (int64_t)pcStack_50;
                      piVar3[2] = (int64_t)peStack_48;
                      piVar3[3] = (int64_t)peStack_40;
                      *(undefined1 (*) [32])((MIR_op_t *)&pbVar40->bb_link + uVar59) = auVar19;
                    }
                    else {
                      if ((((MIR_op_t *)&local_c0->bb_link)->field_0x8 != '\f') ||
                         ((bb_t_conflict)((anon_union_32_12_57d33f68_for_u *)&local_c0->in_edges)->i
                          != local_d8)) {
LAB_0015e8eb:
                        auStack_18c._92_8_ = 0x15e90a;
                        __assert_fail("last_insn->ops[0].mode == MIR_OP_LABEL && last_insn->ops[0].u.label == first_insn"
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                      ,0x3fa,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
                      }
                      pMVar75 = (MIR_op_t *)&local_c0->bb_link;
                      auStack_18c._92_8_ = 0x15e128;
                      MIR_new_label_op(local_c8,local_b8);
                      auVar92._16_8_ = iStack_58;
                      auVar92._0_16_ = local_68;
                      auVar92._24_8_ = pcStack_50;
                      ((anon_union_32_12_57d33f68_for_u *)&pbVar40->in_edges)->i = iStack_58;
                      (((anon_union_32_12_57d33f68_for_u *)&pbVar40->in_edges)->str).s = pcStack_50;
                      (pbVar40->out_edges).head = peStack_48;
                      (pbVar40->out_edges).tail = peStack_40;
                      *(undefined1 (*) [32])pMVar75 = auVar92;
                    }
                    pgVar66 = local_f8;
                    if (((FILE *)local_f8->debug_file == (FILE *)0x0) || (local_f8->debug_level < 4)
                       ) goto LAB_0015e1d8;
                    auStack_18c._92_8_ = 0x15e1c6;
                    fwrite("         to insn ",0x11,1,(FILE *)local_f8->debug_file);
                    pbVar46 = local_a8;
                  }
                  auStack_18c._92_8_ = 0x15da39;
                  print_bb_insn(local_f8,pbVar46,0);
                  pgVar66 = local_f8;
                }
LAB_0015e1d8:
                ppVVar89[1] = (bitmap_t)pbVar38;
                goto LAB_0015d86e;
              }
              peVar51 = (pbVar44->out_edges).head;
              if (peVar51 == (out_edge_t)0x0) goto LAB_0015e7d1;
              lVar84 = 1;
              do {
                peVar51 = (peVar51->out_link).next;
                lVar84 = lVar84 + -1;
              } while (peVar51 != (out_edge_t)0x0);
              if ((lVar84 != 0) ||
                 (peVar52 = (pbVar44->in_edges).head, peVar52 == (in_edge_t_conflict)0x0))
              goto LAB_0015e7d1;
              lVar84 = 1;
              do {
                peVar52 = (peVar52->in_link).next;
                lVar84 = lVar84 + -1;
              } while (peVar52 != (in_edge_t)0x0);
              if (lVar84 != 0) goto LAB_0015e7d1;
            }
            else {
              peVar51 = (pbVar44->out_edges).head;
              if (peVar51 == (out_edge_t)0x0) {
LAB_0015e79b:
                auStack_18c._92_8_ = 0x15e7bd;
                __assert_fail("(DLIST_out_edge_t_length (&(e->src->out_edges))) == 1 && (DLIST_in_edge_t_length (&(e->src->in_edges))) == 1"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x20ce,"void transform_edge_to_bb_placement(gen_ctx_t)");
              }
              lVar84 = 1;
              do {
                peVar51 = (peVar51->out_link).next;
                lVar84 = lVar84 + -1;
              } while (peVar51 != (out_edge_t)0x0);
              if ((lVar84 != 0) ||
                 (peVar52 = (pbVar44->in_edges).head, peVar52 == (in_edge_t_conflict)0x0))
              goto LAB_0015e79b;
              lVar84 = 1;
              do {
                peVar52 = (peVar52->in_link).next;
                lVar84 = lVar84 + -1;
              } while (peVar52 != (in_edge_t)0x0);
              if (lVar84 != 0) goto LAB_0015e79b;
            }
          }
          else {
            pbVar44 = peVar79->dst;
          }
          ppVVar89[1] = (bitmap_t)pbVar44;
        }
        else {
          ppVVar89[1] = (bitmap_t)peVar79->src;
          *(undefined1 *)((long)ppVVar89 + 6) = 1;
        }
LAB_0015d86e:
        uVar25 = uVar25 + 1;
        pVVar35 = pgVar66->ra_ctx->spill_els;
      } while (pVVar35 != (VARR_spill_el_t *)0x0);
    }
    goto LAB_0015e6d7;
  }
LAB_0015e268:
  pVVar35 = pgVar66->ra_ctx->spill_els;
  if (pVVar35 == (VARR_spill_el_t *)0x0) goto LAB_0015e894;
  auStack_18c._92_8_ = 0x15e29e;
  qsort(local_b0,pVVar35->els_num,0x10,spill_el_sort_cmp);
  pVVar35 = pgVar66->ra_ctx->spill_els;
  if (pVVar35 == (VARR_spill_el_t *)0x0) goto LAB_0015e89c;
  sVar86 = pVVar35->els_num;
  if (sVar86 == 0) {
LAB_0015e345:
    pVVar35 = pgVar66->ra_ctx->spill_els;
    if (pVVar35 != (VARR_spill_el_t *)0x0) {
      psVar34 = pVVar35->varr;
      if (((FILE *)pgVar66->debug_file != (FILE *)0x0) && (1 < pgVar66->debug_level)) {
        auStack_18c._92_8_ = 0x15e38e;
        fwrite("+++++++++++++MIR after splitting edges:\n",0x28,1,(FILE *)pgVar66->debug_file);
        auStack_18c._92_8_ = 0x15e3aa;
        print_CFG(local_f8,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
        auStack_18c._92_8_ = 0x15e3c9;
        fwrite("  Spills on BBs:\n",0x11,1,(FILE *)local_f8->debug_file);
        pVVar35 = local_f8->ra_ctx->spill_els;
        if (pVVar35 != (VARR_spill_el_t *)0x0) {
          uVar25 = 0xffffffffffffffff;
          paVar41 = &psVar34->u;
          do {
            uVar25 = uVar25 + 1;
            pgVar66 = local_f8;
            if (pVVar35->els_num <= uVar25) goto LAB_0015e473;
            if (*(char *)((long)paVar41 + -3) != '\0') {
              auStack_18c._92_8_ = 0x15e791;
              __assert_fail("!spill_els_addr[i].edge_p",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                            ,0x2103,"void split(gen_ctx_t)");
            }
            pcVar85 = "spill";
            if (*(char *)((long)paVar41 + -4) == '\0') {
              pcVar85 = "restore";
            }
            pcVar88 = "end";
            if (*(char *)((long)paVar41 + -2) == '\0') {
              pcVar88 = "start";
            }
            auStack_18c._92_8_ = 0x15e453;
            fprintf((FILE *)local_f8->debug_file,"    %s r%d on %s of bb%lu\n",pcVar85,
                    (ulong)((spill_el_t *)(paVar41 + -1))->reg,pcVar88,paVar41->e->src);
            pVVar35 = local_f8->ra_ctx->spill_els;
            paVar41 = paVar41 + 2;
          } while (pVVar35 != (VARR_spill_el_t *)0x0);
        }
        auStack_18c._92_8_ = 0x15e473;
        pgVar66 = local_f8;
        reg_alloc_cold_68();
      }
LAB_0015e473:
      pgVar72 = local_f8;
      pVVar35 = pgVar66->ra_ctx->spill_els;
      if (pVVar35 != (VARR_spill_el_t *)0x0) {
        paVar41 = &psVar34->u;
        uVar25 = 0xffffffffffffffff;
        do {
          uVar25 = uVar25 + 1;
          if (pVVar35->els_num <= uVar25) goto LAB_0015cad0;
          psVar34 = (spill_el_t *)(paVar41 + -1);
          if (psVar34->reg < 0x22) goto LAB_0015e69f;
          pcVar85 = (char *)((long)paVar41 + -4);
          if (*(char *)((long)paVar41 + -2) == '\0') {
            pbVar55 = (paVar41->bb->bb_insns).head;
            bVar90 = *(int *)&pbVar55->insn->field_0x18 == 0xb4;
          }
          else {
            pbVar55 = (paVar41->bb->bb_insns).tail;
            iVar57 = *(int *)&pbVar55->insn->field_0x18;
            bVar90 = (iVar57 - 0xa6U & 0xfffffffb) != 0 && iVar57 - 0xa5U < 0xffffffd1;
          }
          paVar41 = paVar41 + 2;
          auStack_18c._92_8_ = 0x15e51b;
          spill_restore_reg(pgVar72,psVar34->reg,local_cc,pbVar55->insn,(uint)bVar90,
                            (uint)(*pcVar85 == '\0'));
          pVVar35 = pgVar72->ra_ctx->spill_els;
          pgVar66 = pgVar72;
        } while (pVVar35 != (VARR_spill_el_t *)0x0);
      }
      auStack_18c._92_8_ = 0x15e53a;
      reg_alloc_cold_69();
LAB_0015e53a:
      auStack_18c._92_8_ = 0x15e53f;
      reg_alloc_cold_31();
LAB_0015e53f:
      auStack_18c._92_8_ = 0x15e544;
      reg_alloc_cold_30();
LAB_0015e544:
      auStack_18c._92_8_ = 0x15e549;
      reg_alloc_cold_61();
LAB_0015e549:
      auStack_18c._92_8_ = 0x15e54e;
      reg_alloc_cold_27();
LAB_0015e54e:
      auStack_18c._92_8_ = 0x15e56d;
      __assert_fail("nel > ST1_HARD_REG",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x204d,"void collect_spill_els(gen_ctx_t)");
    }
    goto LAB_0015e8a1;
  }
  if (sVar86 != 1) {
    psVar34 = pVVar35->varr;
    lVar84 = sVar86 - 1;
    lVar83 = 0;
    psVar17 = psVar34;
    do {
      e2 = psVar17 + 1;
      auStack_18c._92_8_ = 0x15e2ea;
      iVar57 = spill_el_cmp(psVar34 + lVar83,e2);
      if (iVar57 != 0) {
        lVar83 = lVar83 + 1;
        cVar21 = e2->spill_p;
        cVar22 = e2->edge_p;
        cVar23 = e2->bb_end_p;
        uVar24 = e2->field_0x7;
        aVar18 = psVar17[1].u;
        psVar17 = psVar34 + lVar83;
        psVar17->reg = e2->reg;
        psVar17->spill_p = cVar21;
        psVar17->edge_p = cVar22;
        psVar17->bb_end_p = cVar23;
        psVar17->field_0x7 = uVar24;
        psVar17->u = aVar18;
      }
      lVar84 = lVar84 + -1;
      psVar17 = e2;
    } while (lVar84 != 0);
    sVar86 = lVar83 + 1;
    pgVar66 = local_f8;
  }
  pVVar35 = pgVar66->ra_ctx->spill_els;
  if (((pVVar35 != (VARR_spill_el_t *)0x0) && (pVVar35->varr != (spill_el_t *)0x0)) &&
     (sVar86 <= pVVar35->els_num)) {
    pVVar35->els_num = sVar86;
    goto LAB_0015e345;
  }
  goto LAB_0015e83a;
LAB_0015e5e3:
  auStack_18c._92_8_ = 0x15e5e8;
  reg_alloc_cold_14();
  peVar79 = local_e0;
LAB_0015e5e8:
  local_e0 = peVar79;
  auStack_18c._92_8_ = 0x15e5ed;
  reg_alloc_cold_35();
LAB_0015e5ed:
  auStack_18c._92_8_ = 0x15e5f2;
  reg_alloc_cold_22();
LAB_0015e5f2:
  auStack_18c._92_8_ = 0x15e611;
  __assert_fail("nel > ST1_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x2019,"void rewrite(gen_ctx_t)");
LAB_0015e616:
  local_e0 = peVar79;
  auStack_18c._92_8_ = 0x15e61b;
  reg_alloc_cold_34();
LAB_0015e61b:
  auStack_18c._92_8_ = 0x15e620;
  reg_alloc_cold_33();
LAB_0015e620:
  auStack_18c._92_8_ = 0x15e63f;
  __assert_fail("bitmap_equal_p (live, bb->in)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x2017,"void rewrite(gen_ctx_t)");
LAB_0015e6c3:
  auStack_18c._92_8_ = 0x15e6c8;
  reg_alloc_cold_37();
LAB_0015e6c8:
  auStack_18c._92_8_ = 0x15e6cd;
  reg_alloc_cold_38();
LAB_0015e6cd:
  auStack_18c._92_8_ = 0x15e6d2;
  reg_alloc_cold_24();
LAB_0015e6d2:
  auStack_18c._92_8_ = 0x15e6d7;
  reg_alloc_cold_23();
LAB_0015e6d7:
  auStack_18c._92_8_ = 0x15e6df;
  reg_alloc_cold_58();
LAB_0015e6df:
  auStack_18c._92_8_ = 0x15e6fe;
  __assert_fail("(DLIST_bb_insn_t_head (&(bb->bb_insns))) != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x2041,"void collect_spill_els(gen_ctx_t)");
LAB_0015ca57:
  if (((FILE *)pgVar66->debug_file != (FILE *)0x0) && (0 < pgVar66->debug_level)) {
    auVar91 = vcvtusi2sd_avx512f(auVar91,lVar84);
    dVar16 = auVar91._0_8_ * 100.0;
    auVar91 = vcvtusi2sd_avx512f(auVar93,pbVar38);
    auVar93 = vcvtusi2sd_avx512f(auVar93,lVar83);
    auStack_18c._92_8_ = 0x15caa0;
    fprintf((FILE *)pgVar66->debug_file,
            "%5lu deleted RA noop moves out of %lu all moves (%.1f%%), out of %lu all insns (%.1f%%)\n"
            ,dVar16 / auVar91._0_8_,dVar16 / auVar93._0_8_,lVar84,pbVar38);
    pgVar66 = local_f8;
  }
  uVar63 = (uint)local_e8;
  if (local_c8 != (MIR_context_t)0x0) {
    auStack_18c._92_8_ = 0x15cac2;
    bitmap_and_compl(pgVar66->func_used_hard_regs,pgVar66->func_used_hard_regs,(bitmap_t)local_c8);
    pgVar66 = local_f8;
  }
  if (uVar63 < 2) {
LAB_0015cad0:
    plVar31 = pgVar66->lr_ctx;
    pVVar47 = plVar31->var_live_ranges;
    if (pVVar47 == (VARR_live_range_t *)0x0) goto LAB_0015e830;
    sVar86 = pVVar47->els_num;
    if (sVar86 != 0) {
      pplVar26 = pVVar47->varr;
      if (pplVar26 == (live_range_t_conflict *)0x0) goto LAB_0015e844;
      sVar69 = 0;
      do {
        plVar76 = pplVar26[sVar69];
        if (plVar76 != (live_range_t_conflict)0x0) {
          plVar77 = plVar31->free_lr_list;
          do {
            plVar74 = plVar76;
            plVar76 = plVar74->next;
            if (plVar74->lr_bb != (lr_bb_t_conflict)0x0) {
              plVar61 = plVar31->free_lr_bb_list;
              plVar10 = plVar74->lr_bb;
              do {
                plVar81 = plVar10;
                plVar10 = plVar81->next;
                plVar81->next = plVar61;
                plVar61 = plVar81;
              } while (plVar10 != (lr_bb_t)0x0);
              plVar31->free_lr_bb_list = plVar81;
            }
            plVar74->next = plVar77;
            plVar77 = plVar74;
          } while (plVar76 != (live_range_t)0x0);
          plVar31->free_lr_list = plVar74;
        }
        sVar69 = sVar69 + 1;
      } while (sVar69 != sVar86);
    }
    if (pVVar47->varr != (live_range_t_conflict *)0x0) {
      pVVar47->els_num = 0;
      return;
    }
  }
  else {
    if (((FILE *)pgVar66->debug_file != (FILE *)0x0) && (1 < pgVar66->debug_level)) {
      auStack_18c._92_8_ = 0x15cb94;
      fwrite("+++++++++++++Spill info:\n",0x19,1,(FILE *)pgVar66->debug_file);
      auStack_18c._92_8_ = 0x15cbb1;
      print_CFG(local_f8,1,0,0,0,output_bb_spill_info);
      pgVar66 = local_f8;
    }
    local_cc = 5 - (pgVar66->target_ctx->keep_fp_p == '\0');
    pVVar35 = pgVar66->ra_ctx->spill_els;
    if ((pVVar35 != (VARR_spill_el_t *)0x0) && (pVVar35->varr != (spill_el_t *)0x0)) {
      pVVar35->els_num = 0;
      pgVar72 = (gen_ctx_t)(pgVar66->curr_cfg->bbs).head;
      pgVar73 = local_f0;
      if (pgVar72 != (gen_ctx_t)0x0) {
        iVar57 = -1;
        do {
          pgVar72 = (gen_ctx_t)pgVar72->to_free;
          if (pgVar72 == (gen_ctx_t)0x0) break;
          bVar90 = iVar57 != 0;
          iVar57 = iVar57 + 1;
        } while (bVar90);
      }
      do {
        local_f0 = pgVar72;
        if (local_f0 == (gen_ctx_t)0x0) goto LAB_0015d0a5;
        if (((DLIST_bb_insn_t *)&local_f0->temp_bitmap)->head == (bb_insn_t)0x0) goto LAB_0015e6df;
        __stream = (FILE *)pgVar66->debug_file;
        if ((__stream != (FILE *)0x0) && (1 < pgVar66->debug_level)) {
          pMVar11 = local_f0->ctx;
          auStack_18c._92_8_ = 0x15cc53;
          uVar63 = bb_loop_level((bb_t_conflict)local_f0);
          auStack_18c._92_8_ = 0x15cc69;
          fprintf(__stream," Process BB%lu(level %d) for splitting\n",pMVar11,(ulong)uVar63);
          pgVar66 = local_f8;
        }
        unaff_R13 = (gen_ctx_t)((ulong)unaff_R13 & 0xff0000ffffffffff | 0x1010000000000);
        for (peVar51 = (out_edge_t)local_f0->insn_to_consider; peVar51 != (out_edge_t)0x0;
            peVar51 = (peVar51->out_link).prev) {
          auStack_18c._92_8_ = 0x15ccaf;
          bitmap_and_compl(pgVar66->temp_bitmap,peVar51->dst->gen,local_f0->call_used_hard_regs[2]);
          pVVar45 = local_f8->temp_bitmap;
          if (pVVar45 == (bitmap_t)0x0) {
            auStack_18c._92_8_ = 0x15e616;
            reg_alloc_cold_28();
            peVar79 = local_e0;
            goto LAB_0015e616;
          }
          pgVar66 = local_f8;
          if (pVVar45->els_num != 0) {
            sVar86 = 0;
            do {
              if (pVVar45->varr[sVar86] != 0) {
                pcVar88 = (char *)0x0;
                local_e0 = peVar51;
                goto LAB_0015ccf8;
              }
              sVar86 = sVar86 + 1;
            } while (pVVar45->els_num != sVar86);
          }
LAB_0015ccde:
        }
        peVar62 = (in_edge_t)local_f0->tied_regs;
        peVar79 = local_e0;
        while (local_e0 = peVar62, local_e0 != (in_edge_t)0x0) {
          pVVar45 = pgVar66->temp_bitmap;
          if ((pVVar45 == (bitmap_t)0x0) || (pVVar45->varr == (bitmap_el_t *)0x0))
          goto LAB_0015e5e8;
          pVVar45->els_num = 0;
          pVVar45 = local_e0->src->gen;
          if (pVVar45 == (bitmap_t)0x0) goto LAB_0015e616;
          pgVar72 = local_f0;
          pcVar88 = (char *)0x0;
LAB_0015ce43:
          uVar65 = (ulong)pcVar88 >> 6;
          uVar25 = pVVar45->els_num;
          bVar90 = true;
          pcVar70 = pcVar88;
          if (uVar65 < uVar25) {
            pcVar70 = (char *)(uVar25 << 6);
LAB_0015ce60:
            if ((pVVar45->varr[uVar65] == 0) ||
               (uVar59 = pVVar45->varr[uVar65] >> ((ulong)pcVar88 & 0x3f), uVar59 == 0))
            goto LAB_0015ce73;
            uVar25 = uVar59 & 1;
            pcVar85 = pcVar88;
            while (uVar25 == 0) {
              pcVar85 = pcVar85 + 1;
              uVar25 = uVar59 & 2;
              uVar59 = uVar59 >> 1;
            }
            pcVar70 = pcVar85 + 1;
            bVar90 = false;
          }
LAB_0015cea7:
          if (!bVar90) {
            pVVar33 = pgVar72->call_used_hard_regs[2];
            if (pVVar33 == (bitmap_t)0x0) goto LAB_0015e53a;
            pcVar88 = pcVar70;
            if (((char *)(pVVar33->els_num << 6) <= pcVar85) ||
               ((pVVar33->varr[(ulong)pcVar85 >> 6] >> ((ulong)pcVar85 & 0x3f) & 1) == 0)) {
              pVVar33 = pgVar72->call_used_hard_regs[0];
              if (pVVar33 == (bitmap_t)0x0) goto LAB_0015e53f;
              if ((pcVar85 < (char *)(pVVar33->els_num << 6)) &&
                 ((pVVar33->varr[(ulong)pcVar85 >> 6] >> ((ulong)pcVar85 & 0x3f) & 1) != 0)) {
                pVVar33 = pgVar66->temp_bitmap;
                auStack_18c._92_8_ = 0x15cf27;
                bitmap_expand(pVVar33,(size_t)(pcVar85 + 1));
                if (pVVar33 == (bitmap_t)0x0) {
                  auStack_18c._92_8_ = 0x15e596;
                  reg_alloc_cold_29();
                  goto LAB_0015e596;
                }
                pVVar33->varr[(ulong)pcVar85 >> 6] =
                     pVVar33->varr[(ulong)pcVar85 >> 6] | 1L << ((ulong)pcVar85 & 0x3f);
                pgVar66 = local_f8;
                pgVar72 = local_f0;
              }
            }
            goto LAB_0015ce43;
          }
          pVVar45 = pgVar66->temp_bitmap;
          if (pVVar45 == (bitmap_t)0x0) goto LAB_0015e61b;
          peVar82 = local_e0;
          if (pVVar45->els_num != 0) {
            sVar86 = 0;
            do {
              if (pVVar45->varr[sVar86] != 0) {
                pcVar88 = (char *)0x0;
                goto LAB_0015cf9d;
              }
              sVar86 = sVar86 + 1;
            } while (pVVar45->els_num != sVar86);
          }
LAB_0015cf83:
          peVar79 = local_e0;
          peVar62 = (peVar82->in_link).prev;
        }
        pgVar72 = (gen_ctx_t)local_f0->to_free;
        pgVar73 = local_f0;
        local_e0 = peVar79;
      } while( true );
    }
LAB_0015e82b:
    auStack_18c._92_8_ = 0x15e830;
    reg_alloc_cold_76();
LAB_0015e830:
    auStack_18c._92_8_ = 0x15e835;
    reg_alloc_cold_79();
  }
  auStack_18c._92_8_ = 0x15e83a;
  reg_alloc_cold_78();
LAB_0015e83a:
  auStack_18c._92_8_ = 0x15e83f;
  reg_alloc_cold_71();
LAB_0015e83f:
  auStack_18c._92_8_ = 0x15e844;
  reg_alloc_cold_16();
LAB_0015e844:
  auStack_18c._92_8_ = 0x15e849;
  reg_alloc_cold_77();
LAB_0015e849:
  auStack_18c._92_8_ = 0x15e86b;
  __assert_fail("(DLIST_bb_insn_t_tail (&(e2->src->bb_insns))) != ((void*)0) && MIR_any_branch_code_p ((DLIST_bb_insn_t_tail (&(e2->src->bb_insns)))->insn->code)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x3bd,"bb_t split_edge_if_necessary(gen_ctx_t, edge_t)");
}

Assistant:

static void reg_alloc (gen_ctx_t gen_ctx) {
  MIR_reg_t reg, max_var = get_max_var (gen_ctx);
  const int simplified_p = ONLY_SIMPLIFIED_RA || optimize_level < 2;

  build_live_ranges (gen_ctx);
  assign (gen_ctx);
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++Disposition after assignment:");
    for (reg = MAX_HARD_REG + 1; reg <= max_var; reg++) {
      if ((reg - MAX_HARD_REG + 1) % 8 == 0) fprintf (debug_file, "\n");
      fprintf (debug_file, " %3u=>", reg);
      if (VARR_LENGTH (live_range_t, var_live_ranges) <= reg
          || VARR_GET (live_range_t, var_live_ranges, reg) == NULL)
        fprintf (debug_file, "UA");
      else
        fprintf (debug_file, "%-2u", VARR_GET (MIR_reg_t, reg_renumber, reg));
    }
    fprintf (debug_file, "\n");
  });
  rewrite (gen_ctx); /* After rewrite the BB live info is invalid as it is used for spill info */
  if (!simplified_p) {
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++Spill info:\n");
      print_CFG (gen_ctx, TRUE, FALSE, FALSE, FALSE, output_bb_spill_info);
    });
    split (gen_ctx);
  }
  free_func_live_ranges (gen_ctx);
}